

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_6_dual_sse2
               (uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0,uchar *_blimit1,
               uchar *_limit1,uchar *_thresh1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined6 uVar8;
  undefined4 uVar9;
  undefined6 uVar10;
  undefined4 uVar11;
  undefined6 uVar12;
  undefined4 uVar13;
  undefined6 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ulong *puVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  ulong *puVar38;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  byte bVar39;
  short sVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  byte bVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  byte bVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  byte bVar59;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_02;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  byte bVar64;
  short sVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  byte bVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  byte bVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  byte bVar82;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar46 [16];
  ulong uVar44;
  ulong uVar45;
  undefined8 extraout_XMM0_Qa_01;
  byte bVar48;
  byte bVar53;
  byte bVar58;
  byte bVar63;
  ulong uVar69;
  undefined8 extraout_XMM0_Qb_01;
  byte bVar71;
  byte bVar76;
  byte bVar81;
  byte bVar86;
  undefined1 auVar47 [16];
  ulong uVar70;
  undefined8 extraout_XMM0_Qb_02;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  __m128i alVar87;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  undefined8 *in_stack_00000008;
  __m128i q1q0;
  __m128i p1p0;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i workp_shft1;
  __m128i workp_shft0;
  __m128i workp_b;
  __m128i workp_a;
  __m128i four;
  __m128i work;
  __m128i abs_p1p0;
  __m128i abs_q1q0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i ff;
  __m128i fe;
  __m128i one;
  __m128i qs1qs0;
  __m128i ps1ps0;
  __m128i q0_16;
  __m128i p0_16;
  __m128i q1_16;
  __m128i p1_16;
  __m128i q2_16;
  __m128i p2_16;
  __m128i flat_q0q1;
  __m128i flat_p1p0;
  __m128i q0p0;
  __m128i q1p1;
  __m128i q2p2;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i zero;
  __m128i ff_1;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work_1;
  __m128i filter2filter1;
  __m128i filter;
  __m128i t80;
  __m128i t3t4;
  ulong local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  ulong local_1248 [3];
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [52];
  int local_11b4;
  ulong *local_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 *local_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 *local_1110;
  ulong local_1108;
  undefined8 uStack_1100;
  ulong local_10e8;
  undefined8 uStack_10e0;
  ulong *local_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 *local_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 *local_1090;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined1 local_fd8 [16];
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined1 local_fb8;
  undefined1 uStack_fb7;
  undefined1 uStack_fb6;
  undefined1 uStack_fb5;
  undefined1 uStack_fb4;
  undefined1 uStack_fb3;
  undefined1 uStack_fb2;
  undefined1 uStack_fb1;
  undefined1 uStack_fb0;
  undefined1 uStack_faf;
  undefined1 uStack_fae;
  undefined1 uStack_fad;
  undefined1 uStack_fac;
  undefined1 uStack_fab;
  undefined1 uStack_faa;
  undefined1 uStack_fa9;
  ulong local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  ulong local_f88;
  ulong uStack_f80;
  uint local_f78;
  uint uStack_f74;
  uint uStack_f70;
  uint uStack_f6c;
  char local_ef8;
  char cStack_ef7;
  char cStack_ef6;
  char cStack_ef5;
  char cStack_ef4;
  char cStack_ef3;
  char cStack_ef2;
  char cStack_ef1;
  char cStack_ef0;
  char cStack_eef;
  char cStack_eee;
  char cStack_eed;
  char cStack_eec;
  char cStack_eeb;
  char cStack_eea;
  char cStack_ee9;
  ulong local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  ulong local_ea8;
  ulong uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined1 (*local_e70) [16];
  undefined1 (*local_e68) [16];
  undefined1 (*local_e60) [16];
  ulong *local_e58;
  ulong *local_e50;
  ulong *local_e48;
  ulong *local_e40;
  undefined8 *local_e38;
  undefined8 *local_e30;
  undefined8 *local_e28;
  undefined8 *local_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined1 local_df8;
  undefined1 uStack_df7;
  undefined1 uStack_df6;
  undefined1 uStack_df5;
  undefined1 uStack_df4;
  undefined1 uStack_df3;
  undefined1 uStack_df2;
  undefined1 uStack_df1;
  undefined1 local_dd8;
  undefined1 uStack_dd7;
  undefined1 uStack_dd6;
  undefined1 uStack_dd5;
  undefined1 uStack_dd4;
  undefined1 uStack_dd3;
  undefined1 uStack_dd2;
  undefined1 uStack_dd1;
  undefined1 local_db8;
  undefined1 uStack_db7;
  undefined1 uStack_db6;
  undefined1 uStack_db5;
  undefined1 uStack_db4;
  undefined1 uStack_db3;
  undefined1 uStack_db2;
  undefined1 uStack_db1;
  undefined1 local_d98;
  undefined1 uStack_d97;
  undefined1 uStack_d96;
  undefined1 uStack_d95;
  undefined1 uStack_d94;
  undefined1 uStack_d93;
  undefined1 uStack_d92;
  undefined1 uStack_d91;
  undefined1 local_d78;
  undefined1 uStack_d77;
  undefined1 uStack_d76;
  undefined1 uStack_d75;
  undefined1 uStack_d74;
  undefined1 uStack_d73;
  undefined1 uStack_d72;
  undefined1 uStack_d71;
  undefined1 local_d58;
  undefined1 uStack_d57;
  undefined1 uStack_d56;
  undefined1 uStack_d55;
  undefined1 uStack_d54;
  undefined1 uStack_d53;
  undefined1 uStack_d52;
  undefined1 uStack_d51;
  ulong local_ca8;
  ulong uStack_ca0;
  ulong local_c98;
  ulong uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c68;
  undefined8 uStack_c60;
  ulong local_c58;
  ulong uStack_c50;
  ulong local_c48;
  undefined8 uStack_c40;
  ulong local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined1 local_bda;
  undefined1 local_bd9;
  char local_bc8;
  char cStack_bc7;
  char cStack_bc6;
  char cStack_bc5;
  char cStack_bc4;
  char cStack_bc3;
  char cStack_bc2;
  char cStack_bc1;
  char local_bb8;
  char cStack_bb7;
  char cStack_bb6;
  char cStack_bb5;
  char cStack_bb4;
  char cStack_bb3;
  char cStack_bb2;
  char cStack_bb1;
  char cStack_bb0;
  char cStack_baf;
  char cStack_bae;
  char cStack_bad;
  char cStack_bac;
  char cStack_bab;
  char cStack_baa;
  char cStack_ba9;
  char local_ba8;
  char cStack_ba7;
  char cStack_ba6;
  char cStack_ba5;
  char cStack_ba4;
  char cStack_ba3;
  char cStack_ba2;
  char cStack_ba1;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  ulong local_b38;
  undefined8 uStack_b30;
  ulong local_b28;
  undefined8 uStack_b20;
  byte local_af8;
  byte bStack_af7;
  byte bStack_af6;
  byte bStack_af5;
  byte bStack_af4;
  byte bStack_af3;
  byte bStack_af2;
  byte bStack_af1;
  byte bStack_af0;
  byte bStack_aef;
  byte bStack_aee;
  byte bStack_aed;
  byte bStack_aec;
  byte bStack_aeb;
  byte bStack_aea;
  byte bStack_ae9;
  byte local_ae8;
  byte bStack_ae7;
  byte bStack_ae6;
  byte bStack_ae5;
  byte bStack_ae4;
  byte bStack_ae3;
  byte bStack_ae2;
  byte bStack_ae1;
  byte bStack_ae0;
  byte bStack_adf;
  byte bStack_ade;
  byte bStack_add;
  byte bStack_adc;
  byte bStack_adb;
  byte bStack_ada;
  byte bStack_ad9;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  byte local_aa8;
  byte bStack_aa7;
  byte bStack_aa6;
  byte bStack_aa5;
  byte bStack_aa4;
  byte bStack_aa3;
  byte bStack_aa2;
  byte bStack_aa1;
  byte bStack_aa0;
  byte bStack_a9f;
  byte bStack_a9e;
  byte bStack_a9d;
  byte bStack_a9c;
  byte bStack_a9b;
  byte bStack_a9a;
  byte bStack_a99;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  ulong local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 uStack_a30;
  undefined8 uStack_a20;
  undefined4 local_98c;
  undefined8 local_988;
  undefined8 uStack_980;
  ulong local_918;
  undefined8 uStack_910;
  undefined8 uStack_900;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined1 local_8a8 [16];
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  ulong local_878;
  ulong uStack_870;
  char local_868;
  char cStack_867;
  char cStack_866;
  char cStack_865;
  char cStack_864;
  char cStack_863;
  char cStack_862;
  char cStack_861;
  char cStack_860;
  char cStack_85f;
  char cStack_85e;
  char cStack_85d;
  char cStack_85c;
  char cStack_85b;
  char cStack_85a;
  char cStack_859;
  ulong local_858;
  ulong uStack_850;
  char local_848;
  char cStack_847;
  char cStack_846;
  char cStack_845;
  char cStack_844;
  char cStack_843;
  char cStack_842;
  char cStack_841;
  char cStack_840;
  char cStack_83f;
  char cStack_83e;
  char cStack_83d;
  char cStack_83c;
  char cStack_83b;
  char cStack_83a;
  char cStack_839;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  uint local_7d8;
  uint uStack_7d4;
  uint uStack_7d0;
  uint uStack_7cc;
  short sStack_766;
  short sStack_764;
  short sStack_762;
  short sStack_75e;
  short sStack_75c;
  short sStack_75a;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  short sStack_726;
  short sStack_724;
  short sStack_722;
  short sStack_71e;
  short sStack_71c;
  short sStack_71a;
  short sStack_6f6;
  short sStack_6f4;
  short sStack_6f2;
  short sStack_6ee;
  short sStack_6ec;
  short sStack_6ea;
  short sStack_6c6;
  short sStack_6c4;
  short sStack_6c2;
  short sStack_6be;
  short sStack_6bc;
  short sStack_6ba;
  short sStack_696;
  short sStack_694;
  short sStack_692;
  short sStack_68e;
  short sStack_68c;
  short sStack_68a;
  short sStack_666;
  short sStack_664;
  short sStack_662;
  short sStack_65e;
  short sStack_65c;
  short sStack_65a;
  short sStack_656;
  short sStack_654;
  short sStack_652;
  short sStack_64e;
  short sStack_64c;
  short sStack_64a;
  short sStack_5e6;
  short sStack_5e4;
  short sStack_5e2;
  short sStack_5de;
  short sStack_5dc;
  short sStack_5da;
  short sStack_5c6;
  short sStack_5c4;
  short sStack_5c2;
  short sStack_5be;
  short sStack_5bc;
  short sStack_5ba;
  short sStack_5b6;
  short sStack_5b4;
  short sStack_5b2;
  short sStack_5ae;
  short sStack_5ac;
  short sStack_5aa;
  short sStack_596;
  short sStack_594;
  short sStack_592;
  short sStack_58e;
  short sStack_58c;
  short sStack_58a;
  short sStack_576;
  short sStack_574;
  short sStack_572;
  short sStack_56e;
  short sStack_56c;
  short sStack_56a;
  short sStack_556;
  short sStack_554;
  short sStack_552;
  short sStack_54e;
  short sStack_54c;
  short sStack_54a;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined1 local_528;
  undefined1 local_527;
  undefined1 local_526;
  undefined1 local_525;
  undefined1 local_524;
  undefined1 local_523;
  undefined1 local_522;
  undefined1 local_521;
  undefined1 local_520;
  undefined1 local_51f;
  undefined1 local_51e;
  undefined1 local_51d;
  undefined1 local_51c;
  undefined1 local_51b;
  undefined1 local_51a;
  undefined1 local_519;
  ulong local_518;
  undefined8 uStack_510;
  undefined1 local_508;
  undefined1 local_507;
  undefined1 local_506;
  undefined1 local_505;
  undefined1 local_504;
  undefined1 local_503;
  undefined1 local_502;
  undefined1 local_501;
  undefined1 local_500;
  undefined1 local_4ff;
  undefined1 local_4fe;
  undefined1 local_4fd;
  undefined1 local_4fc;
  undefined1 local_4fb;
  undefined1 local_4fa;
  undefined1 local_4f9;
  undefined8 local_4b8;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined1 local_498;
  undefined1 uStack_497;
  undefined1 uStack_496;
  undefined1 uStack_495;
  undefined1 uStack_494;
  undefined1 uStack_493;
  undefined1 uStack_492;
  undefined1 uStack_491;
  undefined1 uStack_490;
  undefined1 uStack_48f;
  undefined1 uStack_48e;
  undefined1 uStack_48d;
  undefined1 uStack_48c;
  undefined1 uStack_48b;
  undefined1 uStack_48a;
  undefined1 uStack_489;
  undefined8 local_488;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  ulong local_428;
  ulong uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  ulong *local_408;
  ulong *local_400;
  undefined8 *local_3f8;
  ulong *local_3f0;
  ulong *local_3e8;
  ulong *local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong local_398;
  ulong uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  undefined1 local_349;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  ulong uStack_310;
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  undefined8 uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  ulong local_288;
  ulong uStack_280;
  ulong local_278;
  ulong uStack_270;
  undefined8 local_268;
  ulong uStack_260;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  ulong uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  ulong uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  ulong local_198;
  ulong uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  
  local_11b4 = (int)in_RSI;
  uVar1 = *in_RDX;
  uStack_1150 = in_RDX[1];
  uVar2 = *in_R9;
  uStack_1160 = in_R9[1];
  local_1158._0_4_ = (undefined4)uVar1;
  local_1158._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  local_1168._0_4_ = (undefined4)uVar2;
  local_1168._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  local_11e8._0_4_ = (undefined4)local_1158;
  local_11e8._4_4_ = (undefined4)local_1168;
  local_11e8._8_4_ = local_1158._4_4_;
  local_11e8._12_4_ = local_1168._4_4_;
  uVar3 = *in_RCX;
  uStack_1170 = in_RCX[1];
  uVar4 = *in_stack_00000008;
  uStack_1180 = in_stack_00000008[1];
  local_1178._0_4_ = (undefined4)uVar3;
  local_1178._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  local_1188._0_4_ = (undefined4)uVar4;
  local_1188._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
  local_11f8._0_4_ = (undefined4)local_1178;
  local_11f8._4_4_ = (undefined4)local_1188;
  local_11f8._8_4_ = local_1178._4_4_;
  local_11f8._12_4_ = local_1188._4_4_;
  uVar5 = *in_R8;
  uStack_1190 = in_R8[1];
  uVar6 = *(undefined8 *)q1q0[0];
  uStack_11a0 = *(undefined8 *)(q1q0[0] + 8);
  local_1198._0_4_ = (undefined4)uVar5;
  local_1198._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
  local_11a8._0_4_ = (undefined4)uVar6;
  local_11a8._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
  local_1208._0_4_ = (undefined4)local_1198;
  local_1208._4_4_ = (undefined4)local_11a8;
  local_1208._8_4_ = local_1198._4_4_;
  local_1208._12_4_ = local_11a8._4_4_;
  b[0] = in_RSI & 0xffffffff;
  local_1090 = (undefined8 *)((long)in_RDI - (long)(local_11b4 * 3));
  local_1218 = *local_1090;
  uStack_10a0 = 0;
  uStack_1210 = 0;
  local_10b0 = (undefined8 *)((long)in_RDI - (long)(local_11b4 * 2));
  uStack_1270 = *local_10b0;
  uStack_10c0 = 0;
  uStack_1220 = 0;
  local_10d0 = (ulong *)((long)in_RDI - (long)local_11b4);
  local_1248[2] = *local_10d0;
  uStack_10e0 = 0;
  uStack_1230 = 0;
  local_1248[0] = *in_RDI;
  uStack_1100 = 0;
  local_1248[1] = 0;
  local_1110 = (undefined8 *)((long)in_RDI + (long)local_11b4);
  local_1258 = *local_1110;
  uStack_1120 = 0;
  uStack_1250 = 0;
  b[1] = (long)(local_11b4 * 2);
  local_1130 = (undefined8 *)((long)in_RDI + b[1]);
  local_1268 = *local_1130;
  uStack_1140 = 0;
  uStack_1260 = 0;
  local_e20 = &local_1218;
  local_e28 = &local_1268;
  local_e30 = &local_1228;
  local_e38 = &local_1258;
  local_e40 = local_1248 + 2;
  local_e48 = local_1248;
  local_e50 = &local_1288;
  local_e58 = &local_1278;
  local_e60 = (undefined1 (*) [16])local_11e8;
  local_e68 = &local_11f8;
  local_e70 = &local_1208;
  local_e18 = 0;
  uStack_e10 = 0;
  local_e88 = 0;
  uStack_e80 = 0;
  uStack_bf0 = 0;
  uStack_c00 = 0;
  uStack_c10 = 0;
  uStack_c20 = 0;
  uStack_c30 = 0;
  uStack_c40 = 0;
  uStack_ee0._4_4_ = (undefined4)(local_1248[0] >> 0x20);
  uStack_ed0._4_4_ = (undefined4)((ulong)local_1258 >> 0x20);
  local_ec8._0_4_ = (undefined4)local_1218;
  uStack_49c = uStack_ee0._4_4_;
  local_498 = (undefined1)uStack_1270;
  uStack_497 = (undefined1)((ulong)uStack_1270 >> 8);
  uStack_496 = (undefined1)((ulong)uStack_1270 >> 0x10);
  uStack_495 = (undefined1)((ulong)uStack_1270 >> 0x18);
  uStack_4ac = uStack_ed0._4_4_;
  _local_4a8 = CONCAT44((int)(local_1248[2] >> 0x20),(undefined4)local_ec8);
  uStack_1280._0_4_ = uStack_4a0;
  uStack_1280._4_4_ = uStack_ee0._4_4_;
  local_1278 = local_1248[2];
  local_1278._0_4_ = uStack_4b0;
  local_1278._4_4_ = uStack_ed0._4_4_;
  local_bd9 = 1;
  local_519 = 1;
  local_51a = 1;
  local_51b = 1;
  local_51c = 1;
  local_51d = 1;
  local_51e = 1;
  local_51f = 1;
  local_520 = 1;
  local_521 = 1;
  local_522 = 1;
  local_523 = 1;
  local_524 = 1;
  local_525 = 1;
  local_526 = 1;
  local_527 = 1;
  local_528 = 1;
  local_f98 = 0x101010101010101;
  uStack_f90 = 0x101010101010101;
  local_bda = 0xfe;
  local_4f9 = 0xfe;
  local_4fa = 0xfe;
  local_4fb = 0xfe;
  local_4fc = 0xfe;
  local_4fd = 0xfe;
  local_4fe = 0xfe;
  local_4ff = 0xfe;
  local_500 = 0xfe;
  local_501 = 0xfe;
  local_502 = 0xfe;
  local_503 = 0xfe;
  local_504 = 0xfe;
  local_505 = 0xfe;
  local_506 = 0xfe;
  local_507 = 0xfe;
  local_508 = 0xfe;
  local_fa8 = 0xfefefefefefefefe;
  uStack_fa0 = 0xfefefefefefefefe;
  local_fb8 = 0xff;
  uStack_fb7 = 0xff;
  uStack_fb6 = 0xff;
  uStack_fb5 = 0xff;
  uStack_fb4 = 0xff;
  uStack_fb3 = 0xff;
  uStack_fb2 = 0xff;
  uStack_fb1 = 0xff;
  uStack_fb0 = 0xff;
  uStack_faf = 0xff;
  uStack_fae = 0xff;
  uStack_fad = 0xff;
  uStack_fac = 0xff;
  uStack_fab = 0xff;
  uStack_faa = 0xff;
  uStack_fa9 = 0xff;
  a[1] = in_RSI;
  a[0] = (longlong)in_RDI;
  local_1228 = uStack_1270;
  local_11b0 = in_RDI;
  local_11a8 = uVar6;
  local_1198 = uVar5;
  local_1188 = uVar4;
  local_1178 = uVar3;
  local_1168 = uVar2;
  local_1158 = uVar1;
  local_1148 = local_1268;
  local_1128 = local_1258;
  local_1108 = local_1248[0];
  local_10e8 = local_1248[2];
  local_10c8 = uStack_1270;
  local_10a8 = local_1218;
  local_ee8 = local_1248[2];
  uStack_ee0 = local_1248[0];
  local_ed8 = uStack_1270;
  uStack_ed0 = local_1258;
  local_ec8 = local_1218;
  uStack_ec0 = local_1268;
  local_c68 = uStack_1270;
  uStack_c60 = local_1258;
  local_c58 = local_1248[2];
  uStack_c50 = local_1248[0];
  local_c48 = local_1248[0];
  local_c38 = local_1248[2];
  local_c28 = local_1258;
  local_c18 = uStack_1270;
  local_c08 = local_1268;
  local_bf8 = local_1218;
  local_b38 = local_fa8;
  uStack_b30 = uStack_fa0;
  local_b28 = local_fa8;
  uStack_b20 = uStack_fa0;
  local_538 = local_f98;
  uStack_530 = uStack_f90;
  local_518 = local_fa8;
  uStack_510 = uStack_fa0;
  local_4b8 = uStack_1270;
  alVar87 = abs_diff(a,b);
  alVar87[0] = alVar87[1];
  uStack_fe0 = 0;
  alVar87[1] = b[1];
  a_00[1] = in_RSI;
  a_00[0] = (longlong)in_RDI;
  local_ff8 = extraout_XMM0_Qa;
  uStack_ff0 = extraout_XMM0_Qb;
  local_fe8 = extraout_XMM0_Qb;
  alVar87 = abs_diff(a_00,alVar87);
  b_00[0] = alVar87[1];
  local_c88 = local_e88;
  uStack_c80 = uStack_e80;
  local_a68 = local_ff8;
  uVar36 = local_a68;
  uStack_a60 = uStack_ff0;
  uVar37 = uStack_a60;
  local_a78 = local_fe8;
  uVar6 = local_a78;
  uStack_a70 = uStack_fe0;
  uVar35 = uStack_a70;
  local_a68._0_1_ = (byte)local_ff8;
  local_a68._1_1_ = (byte)((ulong)local_ff8 >> 8);
  local_a68._2_1_ = (byte)((ulong)local_ff8 >> 0x10);
  local_a68._3_1_ = (byte)((ulong)local_ff8 >> 0x18);
  local_a68._4_1_ = (byte)((ulong)local_ff8 >> 0x20);
  local_a68._5_1_ = (byte)((ulong)local_ff8 >> 0x28);
  local_a68._6_1_ = (byte)((ulong)local_ff8 >> 0x30);
  local_a68._7_1_ = (byte)((ulong)local_ff8 >> 0x38);
  uStack_a60._0_1_ = (byte)uStack_ff0;
  uStack_a60._1_1_ = (byte)((ulong)uStack_ff0 >> 8);
  uStack_a60._2_1_ = (byte)((ulong)uStack_ff0 >> 0x10);
  uStack_a60._3_1_ = (byte)((ulong)uStack_ff0 >> 0x18);
  uStack_a60._4_1_ = (byte)((ulong)uStack_ff0 >> 0x20);
  uStack_a60._5_1_ = (byte)((ulong)uStack_ff0 >> 0x28);
  uStack_a60._6_1_ = (byte)((ulong)uStack_ff0 >> 0x30);
  uStack_a60._7_1_ = (byte)((ulong)uStack_ff0 >> 0x38);
  local_a78._0_1_ = (byte)local_fe8;
  local_a78._1_1_ = (byte)((ulong)local_fe8 >> 8);
  local_a78._2_1_ = (byte)((ulong)local_fe8 >> 0x10);
  local_a78._3_1_ = (byte)((ulong)local_fe8 >> 0x18);
  local_a78._4_1_ = (byte)((ulong)local_fe8 >> 0x20);
  local_a78._5_1_ = (byte)((ulong)local_fe8 >> 0x28);
  local_a78._6_1_ = (byte)((ulong)local_fe8 >> 0x30);
  local_a78._7_1_ = (byte)((ulong)local_fe8 >> 0x38);
  uStack_a70._0_1_ = (byte)uStack_fe0;
  uStack_a70._1_1_ = (byte)((ulong)uStack_fe0 >> 8);
  uStack_a70._2_1_ = (byte)((ulong)uStack_fe0 >> 0x10);
  uStack_a70._3_1_ = (byte)((ulong)uStack_fe0 >> 0x18);
  uStack_a70._4_1_ = (byte)((ulong)uStack_fe0 >> 0x20);
  uStack_a70._5_1_ = (byte)((ulong)uStack_fe0 >> 0x28);
  uStack_a70._6_1_ = (byte)((ulong)uStack_fe0 >> 0x30);
  uStack_a70._7_1_ = (byte)((ulong)uStack_fe0 >> 0x38);
  local_eb8._0_2_ =
       CONCAT11((local_a68._1_1_ < local_a78._1_1_) * local_a78._1_1_ |
                (local_a68._1_1_ >= local_a78._1_1_) * local_a68._1_1_,
                ((byte)local_a68 < (byte)local_a78) * (byte)local_a78 |
                ((byte)local_a68 >= (byte)local_a78) * (byte)local_a68);
  local_eb8._0_3_ =
       CONCAT12((local_a68._2_1_ < local_a78._2_1_) * local_a78._2_1_ |
                (local_a68._2_1_ >= local_a78._2_1_) * local_a68._2_1_,(undefined2)local_eb8);
  local_eb8._0_4_ =
       CONCAT13((local_a68._3_1_ < local_a78._3_1_) * local_a78._3_1_ |
                (local_a68._3_1_ >= local_a78._3_1_) * local_a68._3_1_,(undefined3)local_eb8);
  local_eb8._0_5_ =
       CONCAT14((local_a68._4_1_ < local_a78._4_1_) * local_a78._4_1_ |
                (local_a68._4_1_ >= local_a78._4_1_) * local_a68._4_1_,(undefined4)local_eb8);
  local_eb8._0_6_ =
       CONCAT15((local_a68._5_1_ < local_a78._5_1_) * local_a78._5_1_ |
                (local_a68._5_1_ >= local_a78._5_1_) * local_a68._5_1_,(undefined5)local_eb8);
  local_eb8._0_7_ =
       CONCAT16((local_a68._6_1_ < local_a78._6_1_) * local_a78._6_1_ |
                (local_a68._6_1_ >= local_a78._6_1_) * local_a68._6_1_,(undefined6)local_eb8);
  local_eb8 = CONCAT17((local_a68._7_1_ < local_a78._7_1_) * local_a78._7_1_ |
                       (local_a68._7_1_ >= local_a78._7_1_) * local_a68._7_1_,(undefined7)local_eb8)
  ;
  uStack_eb0._0_1_ =
       ((byte)uStack_a60 < (byte)uStack_a70) * (byte)uStack_a70 |
       ((byte)uStack_a60 >= (byte)uStack_a70) * (byte)uStack_a60;
  uStack_eb0._1_1_ =
       (uStack_a60._1_1_ < uStack_a70._1_1_) * uStack_a70._1_1_ |
       (uStack_a60._1_1_ >= uStack_a70._1_1_) * uStack_a60._1_1_;
  uStack_eb0._2_1_ =
       (uStack_a60._2_1_ < uStack_a70._2_1_) * uStack_a70._2_1_ |
       (uStack_a60._2_1_ >= uStack_a70._2_1_) * uStack_a60._2_1_;
  uStack_eb0._3_1_ =
       (uStack_a60._3_1_ < uStack_a70._3_1_) * uStack_a70._3_1_ |
       (uStack_a60._3_1_ >= uStack_a70._3_1_) * uStack_a60._3_1_;
  uStack_eb0._4_1_ =
       (uStack_a60._4_1_ < uStack_a70._4_1_) * uStack_a70._4_1_ |
       (uStack_a60._4_1_ >= uStack_a70._4_1_) * uStack_a60._4_1_;
  uStack_eb0._5_1_ =
       (uStack_a60._5_1_ < uStack_a70._5_1_) * uStack_a70._5_1_ |
       (uStack_a60._5_1_ >= uStack_a70._5_1_) * uStack_a60._5_1_;
  uStack_eb0._6_1_ =
       (uStack_a60._6_1_ < uStack_a70._6_1_) * uStack_a70._6_1_ |
       (uStack_a60._6_1_ >= uStack_a70._6_1_) * uStack_a60._6_1_;
  uStack_eb0._7_1_ =
       (uStack_a60._7_1_ < uStack_a70._7_1_) * uStack_a70._7_1_ |
       (uStack_a60._7_1_ >= uStack_a70._7_1_) * uStack_a60._7_1_;
  local_898 = *(undefined8 *)*local_e70;
  uStack_890 = *(undefined8 *)(*local_e70 + 8);
  local_888 = local_eb8;
  uStack_880 = uStack_eb0;
  auVar19._8_8_ = uStack_eb0;
  auVar19._0_8_ = local_eb8;
  auVar46 = psubusb(auVar19,*local_e70);
  local_ea8 = auVar46._0_8_;
  uStack_ea0 = auVar46._8_8_;
  local_b48 = local_ea8;
  uVar70 = local_b48;
  uStack_b40 = uStack_ea0;
  uVar5 = uStack_b40;
  local_b58 = local_e88;
  uVar3 = local_b58;
  uStack_b50 = uStack_e80;
  uVar4 = uStack_b50;
  local_b48._0_1_ = auVar46[0];
  local_b48._1_1_ = auVar46[1];
  local_b48._2_1_ = auVar46[2];
  local_b48._3_1_ = auVar46[3];
  local_b48._4_1_ = auVar46[4];
  local_b48._5_1_ = auVar46[5];
  local_b48._6_1_ = auVar46[6];
  local_b48._7_1_ = auVar46[7];
  uStack_b40._0_1_ = auVar46[8];
  uStack_b40._1_1_ = auVar46[9];
  uStack_b40._2_1_ = auVar46[10];
  uStack_b40._3_1_ = auVar46[0xb];
  uStack_b40._4_1_ = auVar46[0xc];
  uStack_b40._5_1_ = auVar46[0xd];
  uStack_b40._6_1_ = auVar46[0xe];
  uStack_b40._7_1_ = auVar46[0xf];
  local_b58._0_1_ = (char)local_e88;
  local_b58._1_1_ = (char)((ulong)local_e88 >> 8);
  local_b58._2_1_ = (char)((ulong)local_e88 >> 0x10);
  local_b58._3_1_ = (char)((ulong)local_e88 >> 0x18);
  local_b58._4_1_ = (char)((ulong)local_e88 >> 0x20);
  local_b58._5_1_ = (char)((ulong)local_e88 >> 0x28);
  local_b58._6_1_ = (char)((ulong)local_e88 >> 0x30);
  local_b58._7_1_ = (char)((ulong)local_e88 >> 0x38);
  uStack_b50._0_1_ = (char)uStack_e80;
  uStack_b50._1_1_ = (char)((ulong)uStack_e80 >> 8);
  uStack_b50._2_1_ = (char)((ulong)uStack_e80 >> 0x10);
  uStack_b50._3_1_ = (char)((ulong)uStack_e80 >> 0x18);
  uStack_b50._4_1_ = (char)((ulong)uStack_e80 >> 0x20);
  uStack_b50._5_1_ = (char)((ulong)uStack_e80 >> 0x28);
  uStack_b50._6_1_ = (char)((ulong)uStack_e80 >> 0x30);
  uStack_b50._7_1_ = (char)((ulong)uStack_e80 >> 0x38);
  local_848 = -((char)local_b48 == (char)local_b58);
  cStack_847 = -(local_b48._1_1_ == local_b58._1_1_);
  cStack_846 = -(local_b48._2_1_ == local_b58._2_1_);
  cStack_845 = -(local_b48._3_1_ == local_b58._3_1_);
  cStack_844 = -(local_b48._4_1_ == local_b58._4_1_);
  cStack_843 = -(local_b48._5_1_ == local_b58._5_1_);
  cStack_842 = -(local_b48._6_1_ == local_b58._6_1_);
  cStack_841 = -(local_b48._7_1_ == local_b58._7_1_);
  cStack_840 = -((char)uStack_b40 == (char)uStack_b50);
  cStack_83f = -(uStack_b40._1_1_ == uStack_b50._1_1_);
  cStack_83e = -(uStack_b40._2_1_ == uStack_b50._2_1_);
  cStack_83d = -(uStack_b40._3_1_ == uStack_b50._3_1_);
  cStack_83c = -(uStack_b40._4_1_ == uStack_b50._4_1_);
  cStack_83b = -(uStack_b40._5_1_ == uStack_b50._5_1_);
  cStack_83a = -(uStack_b40._6_1_ == uStack_b50._6_1_);
  cStack_839 = -(uStack_b40._7_1_ == uStack_b50._7_1_);
  local_858 = CONCAT17(uStack_fb1,
                       CONCAT16(uStack_fb2,
                                CONCAT15(uStack_fb3,
                                         CONCAT14(uStack_fb4,
                                                  CONCAT13(uStack_fb5,
                                                           CONCAT12(uStack_fb6,
                                                                    CONCAT11(uStack_fb7,local_fb8)))
                                                 ))));
  uStack_850 = CONCAT17(uStack_fa9,
                        CONCAT16(uStack_faa,
                                 CONCAT15(uStack_fab,
                                          CONCAT14(uStack_fac,
                                                   CONCAT13(uStack_fad,
                                                            CONCAT12(uStack_fae,
                                                                     CONCAT11(uStack_faf,uStack_fb0)
                                                                    ))))));
  local_ca8 = CONCAT17(cStack_841,
                       CONCAT16(cStack_842,
                                CONCAT15(cStack_843,
                                         CONCAT14(cStack_844,
                                                  CONCAT13(cStack_845,
                                                           CONCAT12(cStack_846,
                                                                    CONCAT11(cStack_847,local_848)))
                                                 )))) ^ local_858;
  uStack_ca0 = CONCAT17(cStack_839,
                        CONCAT16(cStack_83a,
                                 CONCAT15(cStack_83b,
                                          CONCAT14(cStack_83c,
                                                   CONCAT13(cStack_83d,
                                                            CONCAT12(cStack_83e,
                                                                     CONCAT11(cStack_83f,cStack_840)
                                                                    )))))) ^ uStack_850;
  uStack_a20 = local_e88;
  uStack_a30 = local_e88;
  auVar15._8_8_ = local_e88;
  auVar15._0_8_ = extraout_XMM0_Qa_00;
  auVar47._8_8_ = local_e88;
  auVar47._0_8_ = extraout_XMM0_Qa_00;
  local_fd8 = paddusb(auVar15,auVar47);
  uStack_900 = 0;
  local_918 = local_fa8;
  uStack_910 = uStack_fa0;
  uVar44 = extraout_XMM0_Qb_00 & local_fa8;
  uStack_980 = 0;
  local_98c = 1;
  local_988._0_2_ = (ushort)uVar44;
  local_988._2_2_ = (ushort)(uVar44 >> 0x10);
  local_988._4_2_ = (ushort)(uVar44 >> 0x20);
  local_fc8 = CONCAT26((ushort)(uVar44 >> 0x31),
                       CONCAT24(local_988._4_2_ >> 1,
                                CONCAT22(local_988._2_2_ >> 1,(ushort)local_988 >> 1)));
  uStack_fc0 = 0;
  local_a48 = local_fd8._0_8_;
  uStack_a40 = local_fd8._8_8_;
  local_a58 = local_fc8;
  uStack_a50 = 0;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_fc8;
  local_8a8 = paddusb(local_fd8,auVar46);
  local_8b8 = *(undefined8 *)*local_e60;
  uStack_8b0 = *(undefined8 *)(*local_e60 + 8);
  auVar46 = psubusb(local_8a8,*local_e60);
  local_e98 = auVar46._0_8_;
  uStack_e90 = auVar46._8_8_;
  local_b68 = local_e98;
  uVar1 = local_b68;
  uStack_b60 = uStack_e90;
  uVar2 = uStack_b60;
  local_b78 = local_e88;
  uStack_b70 = uStack_e80;
  local_b68._0_1_ = auVar46[0];
  local_b68._1_1_ = auVar46[1];
  local_b68._2_1_ = auVar46[2];
  local_b68._3_1_ = auVar46[3];
  local_b68._4_1_ = auVar46[4];
  local_b68._5_1_ = auVar46[5];
  local_b68._6_1_ = auVar46[6];
  local_b68._7_1_ = auVar46[7];
  uStack_b60._0_1_ = auVar46[8];
  uStack_b60._1_1_ = auVar46[9];
  uStack_b60._2_1_ = auVar46[10];
  uStack_b60._3_1_ = auVar46[0xb];
  uStack_b60._4_1_ = auVar46[0xc];
  uStack_b60._5_1_ = auVar46[0xd];
  uStack_b60._6_1_ = auVar46[0xe];
  uStack_b60._7_1_ = auVar46[0xf];
  local_868 = -((char)local_b68 == (char)local_b58);
  cStack_867 = -(local_b68._1_1_ == local_b58._1_1_);
  cStack_866 = -(local_b68._2_1_ == local_b58._2_1_);
  cStack_865 = -(local_b68._3_1_ == local_b58._3_1_);
  cStack_864 = -(local_b68._4_1_ == local_b58._4_1_);
  cStack_863 = -(local_b68._5_1_ == local_b58._5_1_);
  cStack_862 = -(local_b68._6_1_ == local_b58._6_1_);
  cStack_861 = -(local_b68._7_1_ == local_b58._7_1_);
  cStack_860 = -((char)uStack_b60 == (char)uStack_b50);
  cStack_85f = -(uStack_b60._1_1_ == uStack_b50._1_1_);
  cStack_85e = -(uStack_b60._2_1_ == uStack_b50._2_1_);
  cStack_85d = -(uStack_b60._3_1_ == uStack_b50._3_1_);
  cStack_85c = -(uStack_b60._4_1_ == uStack_b50._4_1_);
  cStack_85b = -(uStack_b60._5_1_ == uStack_b50._5_1_);
  cStack_85a = -(uStack_b60._6_1_ == uStack_b50._6_1_);
  cStack_859 = -(uStack_b60._7_1_ == uStack_b50._7_1_);
  local_878 = CONCAT17(uStack_fb1,
                       CONCAT16(uStack_fb2,
                                CONCAT15(uStack_fb3,
                                         CONCAT14(uStack_fb4,
                                                  CONCAT13(uStack_fb5,
                                                           CONCAT12(uStack_fb6,
                                                                    CONCAT11(uStack_fb7,local_fb8)))
                                                 ))));
  uStack_870 = CONCAT17(uStack_fa9,
                        CONCAT16(uStack_faa,
                                 CONCAT15(uStack_fab,
                                          CONCAT14(uStack_fac,
                                                   CONCAT13(uStack_fad,
                                                            CONCAT12(uStack_fae,
                                                                     CONCAT11(uStack_faf,uStack_fb0)
                                                                    ))))));
  uVar45 = CONCAT17(cStack_861,
                    CONCAT16(cStack_862,
                             CONCAT15(cStack_863,
                                      CONCAT14(cStack_864,
                                               CONCAT13(cStack_865,
                                                        CONCAT12(cStack_866,
                                                                 CONCAT11(cStack_867,local_868))))))
                   ) ^ local_878;
  uVar69 = CONCAT17(cStack_859,
                    CONCAT16(cStack_85a,
                             CONCAT15(cStack_85b,
                                      CONCAT14(cStack_85c,
                                               CONCAT13(cStack_85d,
                                                        CONCAT12(cStack_85e,
                                                                 CONCAT11(cStack_85f,cStack_860)))))
                            )) ^ uStack_870;
  local_a88 = local_ff8;
  uStack_a80 = uStack_ff0;
  local_a98._0_1_ = (byte)uVar45;
  local_a98._1_1_ = (byte)(uVar45 >> 8);
  local_a98._2_1_ = (byte)(uVar45 >> 0x10);
  local_a98._3_1_ = (byte)(uVar45 >> 0x18);
  local_a98._4_1_ = (byte)(uVar45 >> 0x20);
  local_a98._5_1_ = (byte)(uVar45 >> 0x28);
  local_a98._6_1_ = (byte)(uVar45 >> 0x30);
  local_a98._7_1_ = (byte)(uVar45 >> 0x38);
  uStack_a90._0_1_ = (byte)uVar69;
  uStack_a90._1_1_ = (byte)(uVar69 >> 8);
  uStack_a90._2_1_ = (byte)(uVar69 >> 0x10);
  uStack_a90._3_1_ = (byte)(uVar69 >> 0x18);
  uStack_a90._4_1_ = (byte)(uVar69 >> 0x20);
  uStack_a90._5_1_ = (byte)(uVar69 >> 0x28);
  uStack_a90._6_1_ = (byte)(uVar69 >> 0x30);
  uStack_a90._7_1_ = (byte)(uVar69 >> 0x38);
  local_e98._1_1_ =
       (local_a68._1_1_ < local_a98._1_1_) * local_a98._1_1_ |
       (local_a68._1_1_ >= local_a98._1_1_) * local_a68._1_1_;
  local_e98._0_1_ =
       ((byte)local_a68 < (byte)local_a98) * (byte)local_a98 |
       ((byte)local_a68 >= (byte)local_a98) * (byte)local_a68;
  local_e98._2_1_ =
       (local_a68._2_1_ < local_a98._2_1_) * local_a98._2_1_ |
       (local_a68._2_1_ >= local_a98._2_1_) * local_a68._2_1_;
  local_e98._3_1_ =
       (local_a68._3_1_ < local_a98._3_1_) * local_a98._3_1_ |
       (local_a68._3_1_ >= local_a98._3_1_) * local_a68._3_1_;
  local_e98._4_1_ =
       (local_a68._4_1_ < local_a98._4_1_) * local_a98._4_1_ |
       (local_a68._4_1_ >= local_a98._4_1_) * local_a68._4_1_;
  local_e98._5_1_ =
       (local_a68._5_1_ < local_a98._5_1_) * local_a98._5_1_ |
       (local_a68._5_1_ >= local_a98._5_1_) * local_a68._5_1_;
  local_e98._6_1_ =
       (local_a68._6_1_ < local_a98._6_1_) * local_a98._6_1_ |
       (local_a68._6_1_ >= local_a98._6_1_) * local_a68._6_1_;
  local_e98._7_1_ =
       (local_a68._7_1_ < local_a98._7_1_) * local_a98._7_1_ |
       (local_a68._7_1_ >= local_a98._7_1_) * local_a68._7_1_;
  uStack_e90._0_1_ =
       ((byte)uStack_a60 < (byte)uStack_a90) * (byte)uStack_a90 |
       ((byte)uStack_a60 >= (byte)uStack_a90) * (byte)uStack_a60;
  uStack_e90._1_1_ =
       (uStack_a60._1_1_ < uStack_a90._1_1_) * uStack_a90._1_1_ |
       (uStack_a60._1_1_ >= uStack_a90._1_1_) * uStack_a60._1_1_;
  uStack_e90._2_1_ =
       (uStack_a60._2_1_ < uStack_a90._2_1_) * uStack_a90._2_1_ |
       (uStack_a60._2_1_ >= uStack_a90._2_1_) * uStack_a60._2_1_;
  uStack_e90._3_1_ =
       (uStack_a60._3_1_ < uStack_a90._3_1_) * uStack_a90._3_1_ |
       (uStack_a60._3_1_ >= uStack_a90._3_1_) * uStack_a60._3_1_;
  uStack_e90._4_1_ =
       (uStack_a60._4_1_ < uStack_a90._4_1_) * uStack_a90._4_1_ |
       (uStack_a60._4_1_ >= uStack_a90._4_1_) * uStack_a60._4_1_;
  uStack_e90._5_1_ =
       (uStack_a60._5_1_ < uStack_a90._5_1_) * uStack_a90._5_1_ |
       (uStack_a60._5_1_ >= uStack_a90._5_1_) * uStack_a60._5_1_;
  uStack_e90._6_1_ =
       (uStack_a60._6_1_ < uStack_a90._6_1_) * uStack_a90._6_1_ |
       (uStack_a60._6_1_ >= uStack_a90._6_1_) * uStack_a60._6_1_;
  uStack_e90._7_1_ =
       (uStack_a60._7_1_ < uStack_a90._7_1_) * uStack_a90._7_1_ |
       (uStack_a60._7_1_ >= uStack_a90._7_1_) * uStack_a60._7_1_;
  b_00[1] = b[1];
  a_01[1] = in_RSI;
  a_01[0] = (longlong)in_RDI;
  local_c98 = local_ca8;
  uStack_c90 = uStack_ca0;
  local_b68 = uVar1;
  uStack_b60 = uVar2;
  local_b58 = uVar3;
  uStack_b50 = uVar4;
  local_b48 = uVar70;
  uStack_b40 = uVar5;
  local_a98 = uVar45;
  uStack_a90 = uVar69;
  local_a78 = uVar6;
  uStack_a70 = uVar35;
  local_a68 = uVar36;
  uStack_a60 = uVar37;
  local_988 = uVar44;
  local_ea8 = local_ca8;
  uStack_ea0 = local_ca8;
  abs_diff(a_01,b_00);
  puVar34 = local_e50;
  local_ab8 = local_e98;
  uVar5 = local_ab8;
  uStack_ab0 = uStack_e90;
  uVar6 = uStack_ab0;
  local_aa8 = (byte)extraout_XMM0_Qa_01;
  bStack_aa7 = (byte)((ulong)extraout_XMM0_Qa_01 >> 8);
  bStack_aa6 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x10);
  bStack_aa5 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x18);
  bStack_aa4 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  bStack_aa3 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x28);
  bStack_aa2 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x30);
  bStack_aa1 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x38);
  bStack_aa0 = (byte)extraout_XMM0_Qb_01;
  bStack_a9f = (byte)((ulong)extraout_XMM0_Qb_01 >> 8);
  bStack_a9e = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  bStack_a9d = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x18);
  bStack_a9c = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  bStack_a9b = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x28);
  bStack_a9a = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  bStack_a99 = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x38);
  local_ab8._0_1_ = (byte)local_e98;
  local_ab8._1_1_ = local_e98._1_1_;
  local_ab8._2_1_ = local_e98._2_1_;
  local_ab8._3_1_ = local_e98._3_1_;
  local_ab8._4_1_ = local_e98._4_1_;
  local_ab8._5_1_ = local_e98._5_1_;
  local_ab8._6_1_ = local_e98._6_1_;
  local_ab8._7_1_ = local_e98._7_1_;
  uStack_ab0._0_1_ = local_e98._8_1_;
  uStack_ab0._1_1_ = local_e98._9_1_;
  uStack_ab0._2_1_ = local_e98._10_1_;
  uStack_ab0._3_1_ = local_e98._11_1_;
  uStack_ab0._4_1_ = local_e98._12_1_;
  uStack_ab0._5_1_ = local_e98._13_1_;
  uStack_ab0._6_1_ = local_e98._14_1_;
  uStack_ab0._7_1_ = local_e98._15_1_;
  bVar39 = (local_aa8 < (byte)local_ab8) * (byte)local_ab8 |
           (local_aa8 >= (byte)local_ab8) * local_aa8;
  bVar48 = (bStack_aa7 < local_ab8._1_1_) * local_ab8._1_1_ |
           (bStack_aa7 >= local_ab8._1_1_) * bStack_aa7;
  bVar49 = (bStack_aa6 < local_ab8._2_1_) * local_ab8._2_1_ |
           (bStack_aa6 >= local_ab8._2_1_) * bStack_aa6;
  bVar53 = (bStack_aa5 < local_ab8._3_1_) * local_ab8._3_1_ |
           (bStack_aa5 >= local_ab8._3_1_) * bStack_aa5;
  bVar54 = (bStack_aa4 < local_ab8._4_1_) * local_ab8._4_1_ |
           (bStack_aa4 >= local_ab8._4_1_) * bStack_aa4;
  bVar58 = (bStack_aa3 < local_ab8._5_1_) * local_ab8._5_1_ |
           (bStack_aa3 >= local_ab8._5_1_) * bStack_aa3;
  bVar59 = (bStack_aa2 < local_ab8._6_1_) * local_ab8._6_1_ |
           (bStack_aa2 >= local_ab8._6_1_) * bStack_aa2;
  bVar63 = (bStack_aa1 < local_ab8._7_1_) * local_ab8._7_1_ |
           (bStack_aa1 >= local_ab8._7_1_) * bStack_aa1;
  bVar64 = (bStack_aa0 < (byte)uStack_ab0) * (byte)uStack_ab0 |
           (bStack_aa0 >= (byte)uStack_ab0) * bStack_aa0;
  bVar71 = (bStack_a9f < uStack_ab0._1_1_) * uStack_ab0._1_1_ |
           (bStack_a9f >= uStack_ab0._1_1_) * bStack_a9f;
  bVar72 = (bStack_a9e < uStack_ab0._2_1_) * uStack_ab0._2_1_ |
           (bStack_a9e >= uStack_ab0._2_1_) * bStack_a9e;
  bVar76 = (bStack_a9d < uStack_ab0._3_1_) * uStack_ab0._3_1_ |
           (bStack_a9d >= uStack_ab0._3_1_) * bStack_a9d;
  bVar77 = (bStack_a9c < uStack_ab0._4_1_) * uStack_ab0._4_1_ |
           (bStack_a9c >= uStack_ab0._4_1_) * bStack_a9c;
  bVar81 = (bStack_a9b < uStack_ab0._5_1_) * uStack_ab0._5_1_ |
           (bStack_a9b >= uStack_ab0._5_1_) * bStack_a9b;
  bVar82 = (bStack_a9a < uStack_ab0._6_1_) * uStack_ab0._6_1_ |
           (bStack_a9a >= uStack_ab0._6_1_) * bStack_a9a;
  bVar86 = (bStack_a99 < uStack_ab0._7_1_) * uStack_ab0._7_1_ |
           (bStack_a99 >= uStack_ab0._7_1_) * bStack_a99;
  local_e98._0_2_ = CONCAT11(bVar48,bVar39);
  local_e98._0_3_ = CONCAT12(bVar49,(undefined2)local_e98);
  local_e98._0_4_ = CONCAT13(bVar53,(undefined3)local_e98);
  local_e98._0_5_ = CONCAT14(bVar54,(undefined4)local_e98);
  local_e98._0_6_ = CONCAT15(bVar58,(undefined5)local_e98);
  local_e98._0_7_ = CONCAT16(bVar59,(undefined6)local_e98);
  local_e98 = CONCAT17(bVar63,(undefined7)local_e98);
  uStack_e90._0_1_ = bVar64;
  uStack_e90._1_1_ = bVar71;
  uStack_e90._2_1_ = bVar72;
  uStack_e90._3_1_ = bVar76;
  uStack_e90._4_1_ = bVar77;
  uStack_e90._5_1_ = bVar81;
  uStack_e90._6_1_ = bVar82;
  uStack_e90._7_1_ = bVar86;
  local_ac8 = local_e98;
  uStack_ac0 = uStack_e90;
  local_ad8 = uStack_e90;
  uStack_ad0 = 0;
  local_e98._0_2_ =
       CONCAT11((bVar48 < bVar71) * bVar71 | (bVar48 >= bVar71) * bVar48,
                (bVar39 < bVar64) * bVar64 | (bVar39 >= bVar64) * bVar39);
  local_e98._0_3_ =
       CONCAT12((bVar49 < bVar72) * bVar72 | (bVar49 >= bVar72) * bVar49,(undefined2)local_e98);
  local_e98._0_4_ =
       CONCAT13((bVar53 < bVar76) * bVar76 | (bVar53 >= bVar76) * bVar53,(undefined3)local_e98);
  local_e98._0_5_ =
       CONCAT14((bVar54 < bVar77) * bVar77 | (bVar54 >= bVar77) * bVar54,(undefined4)local_e98);
  local_e98._0_6_ =
       CONCAT15((bVar58 < bVar81) * bVar81 | (bVar58 >= bVar81) * bVar58,(undefined5)local_e98);
  local_e98._0_7_ =
       CONCAT16((bVar59 < bVar82) * bVar82 | (bVar59 >= bVar82) * bVar59,(undefined6)local_e98);
  local_e98 = CONCAT17((bVar63 < bVar86) * bVar86 | (bVar63 >= bVar86) * bVar63,
                       (undefined7)local_e98);
  local_8d8 = *(undefined8 *)*local_e68;
  uStack_8d0 = *(undefined8 *)(*local_e68 + 8);
  local_8c8 = local_e98;
  uStack_8c0 = uStack_e90;
  auVar18._8_8_ = uStack_e90;
  auVar18._0_8_ = local_e98;
  auVar46 = psubusb(auVar18,*local_e68);
  local_e98 = auVar46._0_8_;
  uStack_e90 = auVar46._8_8_;
  local_b88 = local_e98;
  uVar3 = local_b88;
  uStack_b80 = uStack_e90;
  uVar4 = uStack_b80;
  local_b98 = local_e88;
  uVar1 = local_b98;
  uStack_b90 = uStack_e80;
  uVar2 = uStack_b90;
  local_b88._0_1_ = auVar46[0];
  local_b88._1_1_ = auVar46[1];
  local_b88._2_1_ = auVar46[2];
  local_b88._3_1_ = auVar46[3];
  local_b88._4_1_ = auVar46[4];
  local_b88._5_1_ = auVar46[5];
  local_b88._6_1_ = auVar46[6];
  local_b88._7_1_ = auVar46[7];
  uStack_b80._0_1_ = auVar46[8];
  uStack_b80._1_1_ = auVar46[9];
  uStack_b80._2_1_ = auVar46[10];
  uStack_b80._3_1_ = auVar46[0xb];
  uStack_b80._4_1_ = auVar46[0xc];
  uStack_b80._5_1_ = auVar46[0xd];
  uStack_b80._6_1_ = auVar46[0xe];
  uStack_b80._7_1_ = auVar46[0xf];
  local_b98._0_1_ = (char)local_e88;
  local_b98._1_1_ = (char)((ulong)local_e88 >> 8);
  local_b98._2_1_ = (char)((ulong)local_e88 >> 0x10);
  local_b98._3_1_ = (char)((ulong)local_e88 >> 0x18);
  local_b98._4_1_ = (char)((ulong)local_e88 >> 0x20);
  local_b98._5_1_ = (char)((ulong)local_e88 >> 0x28);
  local_b98._6_1_ = (char)((ulong)local_e88 >> 0x30);
  local_b98._7_1_ = (char)((ulong)local_e88 >> 0x38);
  uStack_b90._0_1_ = (char)uStack_e80;
  uStack_b90._1_1_ = (char)((ulong)uStack_e80 >> 8);
  uStack_b90._2_1_ = (char)((ulong)uStack_e80 >> 0x10);
  uStack_b90._3_1_ = (char)((ulong)uStack_e80 >> 0x18);
  uStack_b90._4_1_ = (char)((ulong)uStack_e80 >> 0x20);
  uStack_b90._5_1_ = (char)((ulong)uStack_e80 >> 0x28);
  uStack_b90._6_1_ = (char)((ulong)uStack_e80 >> 0x30);
  uStack_b90._7_1_ = (char)((ulong)uStack_e80 >> 0x38);
  local_e98._0_2_ =
       CONCAT11(-(local_b88._1_1_ == local_b98._1_1_),-((char)local_b88 == (char)local_b98));
  local_e98._0_3_ = CONCAT12(-(local_b88._2_1_ == local_b98._2_1_),(undefined2)local_e98);
  local_e98._0_4_ = CONCAT13(-(local_b88._3_1_ == local_b98._3_1_),(undefined3)local_e98);
  local_e98._0_5_ = CONCAT14(-(local_b88._4_1_ == local_b98._4_1_),(undefined4)local_e98);
  local_e98._0_6_ = CONCAT15(-(local_b88._5_1_ == local_b98._5_1_),(undefined5)local_e98);
  local_e98._0_7_ = CONCAT16(-(local_b88._6_1_ == local_b98._6_1_),(undefined6)local_e98);
  local_e98 = CONCAT17(-(local_b88._7_1_ == local_b98._7_1_),(undefined7)local_e98);
  uStack_e90._0_1_ = -((char)uStack_b80 == (char)uStack_b90);
  uStack_e90._1_1_ = -(uStack_b80._1_1_ == uStack_b90._1_1_);
  uStack_e90._2_1_ = -(uStack_b80._2_1_ == uStack_b90._2_1_);
  uStack_e90._3_1_ = -(uStack_b80._3_1_ == uStack_b90._3_1_);
  uStack_e90._4_1_ = -(uStack_b80._4_1_ == uStack_b90._4_1_);
  uStack_e90._5_1_ = -(uStack_b80._5_1_ == uStack_b90._5_1_);
  uStack_e90._6_1_ = -(uStack_b80._6_1_ == uStack_b90._6_1_);
  uStack_e90._7_1_ = -(uStack_b80._7_1_ == uStack_b90._7_1_);
  local_3e0 = local_e58;
  local_3e8 = local_e50;
  local_3f0 = &local_ea8;
  local_400 = local_e50;
  local_408 = local_e58;
  local_9d = 3;
  local_9e = 3;
  local_9f = 3;
  local_a0 = 3;
  local_a1 = 3;
  local_a2 = 3;
  local_a3 = 3;
  local_a4 = 3;
  local_a5 = 4;
  local_a6 = 4;
  local_a7 = 4;
  local_a8 = 4;
  local_a9 = 4;
  local_aa = 4;
  local_ab = 4;
  local_ac = 4;
  local_418 = 0x404040404040404;
  uStack_410 = 0x303030303030303;
  local_349 = 0x80;
  local_c9 = 0x80;
  local_ca = 0x80;
  local_cb = 0x80;
  local_cc = 0x80;
  local_cd = 0x80;
  local_ce = 0x80;
  local_cf = 0x80;
  local_d0 = 0x80;
  local_d1 = 0x80;
  local_d2 = 0x80;
  local_d3 = 0x80;
  local_d4 = 0x80;
  local_d5 = 0x80;
  local_d6 = 0x80;
  local_d7 = 0x80;
  local_d8 = 0x80;
  local_428 = 0x8080808080808080;
  uStack_420 = 0x8080808080808080;
  local_498 = 0xff;
  uStack_497 = 0xff;
  uStack_496 = 0xff;
  uStack_495 = 0xff;
  uStack_494 = 0xff;
  uStack_493 = 0xff;
  uStack_492 = 0xff;
  uStack_491 = 0xff;
  uStack_490 = 0xff;
  uStack_48f = 0xff;
  uStack_48e = 0xff;
  uStack_48d = 0xff;
  uStack_48c = 0xff;
  uStack_48b = 0xff;
  uStack_48a = 0xff;
  uStack_489 = 0xff;
  local_278 = *local_e58;
  uStack_270 = local_e58[1];
  local_1b8 = local_278 ^ 0x8080808080808080;
  uStack_1b0 = uStack_270 ^ 0x8080808080808080;
  local_298 = *local_e50;
  uStack_290 = local_e50[1];
  local_1c8 = local_298 ^ 0x8080808080808080;
  uStack_250 = uStack_290 ^ 0x8080808080808080;
  auVar26._8_8_ = uStack_1b0;
  auVar26._0_8_ = local_1b8;
  auVar25._8_8_ = uStack_250;
  auVar25._0_8_ = local_1c8;
  local_458 = psubsb(auVar26,auVar25);
  local_308 = local_ea8;
  uStack_300 = uStack_ea0;
  local_2f8 = local_458._8_8_;
  uStack_2f0 = 0;
  local_1d8 = local_458._8_8_ & local_ea8;
  uStack_1d0 = 0;
  local_1e8 = local_458._0_8_;
  uStack_1e0 = local_458._8_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_1d8;
  auVar46 = psubsb(auVar24,local_458);
  local_438 = auVar46._0_8_;
  uStack_430 = auVar46._8_8_;
  local_1f8 = local_438;
  uStack_1f0 = uStack_430;
  local_208 = local_458._0_8_;
  uStack_200 = local_458._8_8_;
  auVar46 = psubsb(auVar46,local_458);
  local_438 = auVar46._0_8_;
  uStack_430 = auVar46._8_8_;
  local_218 = local_438;
  uStack_210 = uStack_430;
  local_228 = local_458._0_8_;
  uStack_220 = local_458._8_8_;
  auVar46 = psubsb(auVar46,local_458);
  local_438 = auVar46._0_8_;
  uStack_430 = auVar46._8_8_;
  local_328 = local_e98;
  uStack_320 = uStack_e90;
  local_318 = local_438;
  uStack_310 = uStack_430;
  local_378 = local_438 & local_e98;
  uStack_370 = uStack_430 & uStack_e90;
  auVar30._8_8_ = local_378;
  auVar30._0_8_ = local_378;
  auVar29._8_8_ = 0x303030303030303;
  auVar29._0_8_ = 0x404040404040404;
  auVar46 = paddsb(auVar30,auVar29);
  local_448 = auVar46._0_8_;
  uStack_440 = auVar46._8_8_;
  local_138 = local_448;
  uStack_130 = uStack_440;
  uVar37 = uStack_130;
  local_148 = local_448;
  uStack_140 = uStack_440;
  uStack_130._0_1_ = auVar46[8];
  uStack_130._1_1_ = auVar46[9];
  uStack_130._2_1_ = auVar46[10];
  uStack_130._3_1_ = auVar46[0xb];
  uStack_130._4_1_ = auVar46[0xc];
  uStack_130._5_1_ = auVar46[0xd];
  uStack_130._6_1_ = auVar46[0xe];
  uStack_130._7_1_ = auVar46[0xf];
  local_438._0_2_ = CONCAT11((undefined1)uStack_130,(undefined1)uStack_130);
  local_438._0_3_ = CONCAT12(uStack_130._1_1_,(undefined2)local_438);
  local_438._0_4_ = CONCAT13(uStack_130._1_1_,(undefined3)local_438);
  local_438._0_5_ = CONCAT14(uStack_130._2_1_,(undefined4)local_438);
  local_438._0_6_ = CONCAT15(uStack_130._2_1_,(undefined5)local_438);
  local_438._0_7_ = CONCAT16(uStack_130._3_1_,(undefined6)local_438);
  local_438 = CONCAT17(uStack_130._3_1_,(undefined7)local_438);
  uStack_430._0_1_ = uStack_130._4_1_;
  uStack_430._1_1_ = uStack_130._4_1_;
  uStack_430._2_1_ = uStack_130._5_1_;
  uStack_430._3_1_ = uStack_130._5_1_;
  uStack_430._4_1_ = uStack_130._6_1_;
  uStack_430._5_1_ = uStack_130._6_1_;
  uStack_430._6_1_ = uStack_130._7_1_;
  uStack_430._7_1_ = uStack_130._7_1_;
  local_3a8 = local_448;
  uVar36 = local_3a8;
  uStack_3a0 = uStack_440;
  local_3b8 = local_448;
  uStack_3b0 = uStack_440;
  local_3a8._0_1_ = auVar46[0];
  local_3a8._1_1_ = auVar46[1];
  local_3a8._2_1_ = auVar46[2];
  local_3a8._3_1_ = auVar46[3];
  local_3a8._4_1_ = auVar46[4];
  local_3a8._5_1_ = auVar46[5];
  local_3a8._6_1_ = auVar46[6];
  local_3a8._7_1_ = auVar46[7];
  local_448._0_2_ = CONCAT11((undefined1)local_3a8,(undefined1)local_3a8);
  local_448._0_3_ = CONCAT12(local_3a8._1_1_,(undefined2)local_448);
  local_448._0_4_ = CONCAT13(local_3a8._1_1_,(undefined3)local_448);
  local_448._0_5_ = CONCAT14(local_3a8._2_1_,(undefined4)local_448);
  local_448._0_6_ = CONCAT15(local_3a8._2_1_,(undefined5)local_448);
  local_448._0_7_ = CONCAT16(local_3a8._3_1_,(undefined6)local_448);
  local_448 = CONCAT17(local_3a8._3_1_,(undefined7)local_448);
  uStack_440._0_1_ = local_3a8._4_1_;
  uStack_440._1_1_ = local_3a8._4_1_;
  uStack_440._2_1_ = local_3a8._5_1_;
  uStack_440._3_1_ = local_3a8._5_1_;
  uStack_440._4_1_ = local_3a8._6_1_;
  uStack_440._5_1_ = local_3a8._6_1_;
  uStack_440._6_1_ = local_3a8._7_1_;
  uStack_440._7_1_ = local_3a8._7_1_;
  local_58 = local_448;
  uStack_50 = uStack_440;
  local_5c = 0xb;
  auVar33._8_8_ = uStack_440;
  auVar33._0_8_ = local_448;
  auVar46 = psraw(auVar33,ZEXT416(0xb));
  local_78 = local_438;
  uStack_70 = uStack_430;
  local_7c = 0xb;
  auVar32._8_8_ = uStack_430;
  auVar32._0_8_ = local_438;
  auVar47 = psraw(auVar32,ZEXT416(0xb));
  local_448 = auVar46._0_8_;
  uStack_440 = auVar46._8_8_;
  local_438 = auVar47._0_8_;
  uStack_430 = auVar47._8_8_;
  local_f8 = local_448;
  uStack_f0 = uStack_440;
  local_108 = local_438;
  uStack_100 = uStack_430;
  auVar47 = packsswb(auVar46,auVar47);
  local_448 = auVar47._0_8_;
  uStack_440 = auVar47._8_8_;
  uStack_380 = uStack_440;
  local_248 = 0xffffffffffffffff;
  uStack_240 = 0xffffffffffffffff;
  local_238 = local_448;
  uStack_230 = uStack_440;
  auVar23._8_8_ = 0xffffffffffffffff;
  auVar23._0_8_ = 0xffffffffffffffff;
  auVar46 = psubsb(auVar47,auVar23);
  local_438 = auVar46._0_8_;
  uStack_430 = auVar46._8_8_;
  local_3c8 = local_438;
  uVar35 = local_3c8;
  uStack_3c0 = uStack_430;
  local_3d8 = local_438;
  uStack_3d0 = uStack_430;
  local_3c8._0_1_ = auVar46[0];
  local_3c8._1_1_ = auVar46[1];
  local_3c8._2_1_ = auVar46[2];
  local_3c8._3_1_ = auVar46[3];
  local_3c8._4_1_ = auVar46[4];
  local_3c8._5_1_ = auVar46[5];
  local_3c8._6_1_ = auVar46[6];
  local_3c8._7_1_ = auVar46[7];
  local_438._0_2_ = CONCAT11((undefined1)local_3c8,(undefined1)local_3c8);
  local_438._0_3_ = CONCAT12(local_3c8._1_1_,(undefined2)local_438);
  local_438._0_4_ = CONCAT13(local_3c8._1_1_,(undefined3)local_438);
  local_438._0_5_ = CONCAT14(local_3c8._2_1_,(undefined4)local_438);
  local_438._0_6_ = CONCAT15(local_3c8._2_1_,(undefined5)local_438);
  local_438._0_7_ = CONCAT16(local_3c8._3_1_,(undefined6)local_438);
  local_438 = CONCAT17(local_3c8._3_1_,(undefined7)local_438);
  uStack_430._0_1_ = local_3c8._4_1_;
  uStack_430._1_1_ = local_3c8._4_1_;
  uStack_430._2_1_ = local_3c8._5_1_;
  uStack_430._3_1_ = local_3c8._5_1_;
  uStack_430._4_1_ = local_3c8._6_1_;
  uStack_430._5_1_ = local_3c8._6_1_;
  uStack_430._6_1_ = local_3c8._7_1_;
  uStack_430._7_1_ = local_3c8._7_1_;
  local_98 = local_438;
  uStack_90 = uStack_430;
  local_9c = 9;
  auVar31._8_8_ = uStack_430;
  auVar31._0_8_ = local_438;
  auVar46 = psraw(auVar31,ZEXT416(9));
  local_438 = auVar46._0_8_;
  uStack_430 = auVar46._8_8_;
  local_118 = local_438;
  uStack_110 = uStack_430;
  local_128 = local_438;
  uStack_120 = uStack_430;
  auVar46 = packsswb(auVar46,auVar46);
  local_158 = local_ea8;
  uStack_150 = uStack_ea0;
  local_438 = auVar46._0_8_;
  uStack_430 = auVar46._8_8_;
  local_168 = local_438;
  uStack_160 = uStack_430;
  local_398 = ~local_ea8 & local_438;
  uStack_390 = ~uStack_ea0 & uStack_430;
  uStack_430 = uStack_390;
  local_438 = local_398;
  auVar46 = _local_438;
  uStack_440._4_4_ = auVar47._12_4_;
  uVar7 = uStack_440._4_4_;
  local_438._0_4_ = (undefined4)local_398;
  uStack_430._4_4_ = (undefined4)(uStack_390 >> 0x20);
  uStack_2c = uStack_440._4_4_;
  _local_28 = CONCAT44(uStack_24,(undefined4)local_438);
  uStack_3c = uStack_430._4_4_;
  _local_38 = CONCAT44(auVar47._4_4_,0x80808080);
  uStack_480 = uStack_30;
  uStack_47c = uStack_440._4_4_;
  local_478._4_4_ = uStack_430._4_4_;
  local_478._0_4_ = uStack_40;
  local_388 = local_448;
  uStack_440 = local_398;
  local_258 = local_478._0_8_;
  local_268 = local_448;
  auVar22._8_8_ = uStack_250;
  auVar22._0_8_ = local_478._0_8_;
  auVar21._8_8_ = local_398;
  auVar21._0_8_ = local_448;
  local_478 = psubsb(auVar22,auVar21);
  uStack_1a0 = CONCAT44(uVar7,uStack_30);
  local_1a8 = local_488;
  auVar28._8_8_ = uStack_1b0;
  auVar28._0_8_ = local_1b8;
  auVar27._8_8_ = uStack_1a0;
  auVar27._0_8_ = local_488;
  local_468 = paddsb(auVar28,auVar27);
  local_2b8 = local_478._0_8_;
  uStack_2b0 = local_478._8_8_;
  uVar70 = local_478._8_8_ ^ 0x8080808080808080;
  local_b98 = uVar1;
  uStack_b90 = uVar2;
  local_b88 = uVar3;
  uStack_b80 = uVar4;
  local_ab8 = uVar5;
  uStack_ab0 = uVar6;
  _local_438 = auVar46;
  local_3f8 = &local_e98;
  local_3c8 = uVar35;
  local_3a8 = uVar36;
  local_368 = local_378;
  uStack_360 = uStack_370;
  local_348 = local_428;
  uStack_340 = uStack_420;
  local_338 = local_428;
  uStack_330 = uStack_420;
  local_2c8 = local_428;
  uStack_2c0 = uStack_420;
  local_2a8 = local_428;
  uStack_2a0 = uStack_420;
  local_288 = local_428;
  uStack_280 = uStack_420;
  uStack_260 = local_398;
  uStack_1c0 = uStack_250;
  local_198 = local_1b8;
  uStack_190 = uStack_1b0;
  local_188 = local_418;
  uStack_180 = uStack_410;
  local_178 = local_378;
  uStack_170 = local_378;
  uStack_130 = uVar37;
  local_e8 = local_428;
  uStack_e0 = uStack_420;
  local_c8 = local_418;
  uStack_c0 = uStack_410;
  local_48 = local_398;
  *local_e50 = local_478._0_8_ ^ 0x8080808080808080;
  puVar34[1] = uVar70;
  puVar38 = local_408;
  local_2d8 = local_468._0_8_;
  uStack_2d0 = local_468._8_8_;
  local_2e8 = local_428;
  uStack_2e0 = uStack_420;
  uVar70 = local_468._8_8_ ^ uStack_420;
  *local_408 = local_468._0_8_ ^ local_428;
  puVar38[1] = uVar70;
  b_01[1] = (longlong)puVar34;
  b_01[0] = (longlong)&local_e98;
  a_02[1] = in_RSI;
  a_02[0] = (longlong)in_RDI;
  abs_diff(a_02,b_01);
  puVar34 = local_e50;
  local_ae8 = (byte)extraout_XMM0_Qa_02;
  bStack_ae7 = (byte)((ulong)extraout_XMM0_Qa_02 >> 8);
  bStack_ae6 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x10);
  bStack_ae5 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x18);
  bStack_ae4 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  bStack_ae3 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x28);
  bStack_ae2 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x30);
  bStack_ae1 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x38);
  bStack_ae0 = (byte)extraout_XMM0_Qb_02;
  bStack_adf = (byte)((ulong)extraout_XMM0_Qb_02 >> 8);
  bStack_ade = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  bStack_add = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x18);
  bStack_adc = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  bStack_adb = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x28);
  bStack_ada = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  bStack_ad9 = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x38);
  local_af8 = (byte)local_ff8;
  bStack_af7 = (byte)((ulong)local_ff8 >> 8);
  bStack_af6 = (byte)((ulong)local_ff8 >> 0x10);
  bStack_af5 = (byte)((ulong)local_ff8 >> 0x18);
  bStack_af4 = (byte)((ulong)local_ff8 >> 0x20);
  bStack_af3 = (byte)((ulong)local_ff8 >> 0x28);
  bStack_af2 = (byte)((ulong)local_ff8 >> 0x30);
  bStack_af1 = (byte)((ulong)local_ff8 >> 0x38);
  bStack_af0 = (byte)uStack_ff0;
  bStack_aef = (byte)((ulong)uStack_ff0 >> 8);
  bStack_aee = (byte)((ulong)uStack_ff0 >> 0x10);
  bStack_aed = (byte)((ulong)uStack_ff0 >> 0x18);
  bStack_aec = (byte)((ulong)uStack_ff0 >> 0x20);
  bStack_aeb = (byte)((ulong)uStack_ff0 >> 0x28);
  bStack_aea = (byte)((ulong)uStack_ff0 >> 0x30);
  bStack_ae9 = (byte)((ulong)uStack_ff0 >> 0x38);
  bVar39 = (local_ae8 < local_af8) * local_af8 | (local_ae8 >= local_af8) * local_ae8;
  bVar48 = (bStack_ae7 < bStack_af7) * bStack_af7 | (bStack_ae7 >= bStack_af7) * bStack_ae7;
  bVar49 = (bStack_ae6 < bStack_af6) * bStack_af6 | (bStack_ae6 >= bStack_af6) * bStack_ae6;
  bVar53 = (bStack_ae5 < bStack_af5) * bStack_af5 | (bStack_ae5 >= bStack_af5) * bStack_ae5;
  bVar54 = (bStack_ae4 < bStack_af4) * bStack_af4 | (bStack_ae4 >= bStack_af4) * bStack_ae4;
  bVar58 = (bStack_ae3 < bStack_af3) * bStack_af3 | (bStack_ae3 >= bStack_af3) * bStack_ae3;
  bVar59 = (bStack_ae2 < bStack_af2) * bStack_af2 | (bStack_ae2 >= bStack_af2) * bStack_ae2;
  bVar63 = (bStack_ae1 < bStack_af1) * bStack_af1 | (bStack_ae1 >= bStack_af1) * bStack_ae1;
  uStack_eb0._0_1_ =
       (bStack_ae0 < bStack_af0) * bStack_af0 | (bStack_ae0 >= bStack_af0) * bStack_ae0;
  uStack_eb0._1_1_ =
       (bStack_adf < bStack_aef) * bStack_aef | (bStack_adf >= bStack_aef) * bStack_adf;
  uStack_eb0._2_1_ =
       (bStack_ade < bStack_aee) * bStack_aee | (bStack_ade >= bStack_aee) * bStack_ade;
  uStack_eb0._3_1_ =
       (bStack_add < bStack_aed) * bStack_aed | (bStack_add >= bStack_aed) * bStack_add;
  uStack_eb0._4_1_ =
       (bStack_adc < bStack_aec) * bStack_aec | (bStack_adc >= bStack_aec) * bStack_adc;
  uStack_eb0._5_1_ =
       (bStack_adb < bStack_aeb) * bStack_aeb | (bStack_adb >= bStack_aeb) * bStack_adb;
  uStack_eb0._6_1_ =
       (bStack_ada < bStack_aea) * bStack_aea | (bStack_ada >= bStack_aea) * bStack_ada;
  uStack_eb0._7_1_ =
       (bStack_ad9 < bStack_ae9) * bStack_ae9 | (bStack_ad9 >= bStack_ae9) * bStack_ad9;
  local_eb8._0_2_ =
       CONCAT11((bVar48 < uStack_eb0._1_1_) * uStack_eb0._1_1_ |
                (bVar48 >= uStack_eb0._1_1_) * bVar48,
                (bVar39 < (byte)uStack_eb0) * (byte)uStack_eb0 |
                (bVar39 >= (byte)uStack_eb0) * bVar39);
  local_eb8._0_3_ =
       CONCAT12((bVar49 < uStack_eb0._2_1_) * uStack_eb0._2_1_ |
                (bVar49 >= uStack_eb0._2_1_) * bVar49,(undefined2)local_eb8);
  local_eb8._0_4_ =
       CONCAT13((bVar53 < uStack_eb0._3_1_) * uStack_eb0._3_1_ |
                (bVar53 >= uStack_eb0._3_1_) * bVar53,(undefined3)local_eb8);
  local_eb8._0_5_ =
       CONCAT14((bVar54 < uStack_eb0._4_1_) * uStack_eb0._4_1_ |
                (bVar54 >= uStack_eb0._4_1_) * bVar54,(undefined4)local_eb8);
  local_eb8._0_6_ =
       CONCAT15((bVar58 < uStack_eb0._5_1_) * uStack_eb0._5_1_ |
                (bVar58 >= uStack_eb0._5_1_) * bVar58,(undefined5)local_eb8);
  local_eb8._0_7_ =
       CONCAT16((bVar59 < uStack_eb0._6_1_) * uStack_eb0._6_1_ |
                (bVar59 >= uStack_eb0._6_1_) * bVar59,(undefined6)local_eb8);
  local_eb8 = CONCAT17((bVar63 < uStack_eb0._7_1_) * uStack_eb0._7_1_ |
                       (bVar63 >= uStack_eb0._7_1_) * bVar63,(undefined7)local_eb8);
  auVar17._8_8_ = uStack_eb0;
  auVar17._0_8_ = local_eb8;
  auVar16._8_8_ = uStack_f90;
  auVar16._0_8_ = local_f98;
  auVar46 = psubusb(auVar17,auVar16);
  local_ba8 = auVar46[0];
  cStack_ba7 = auVar46[1];
  cStack_ba6 = auVar46[2];
  cStack_ba5 = auVar46[3];
  cStack_ba4 = auVar46[4];
  cStack_ba3 = auVar46[5];
  cStack_ba2 = auVar46[6];
  cStack_ba1 = auVar46[7];
  local_bb8 = (char)local_e88;
  cStack_bb7 = (char)((ulong)local_e88 >> 8);
  cStack_bb6 = (char)((ulong)local_e88 >> 0x10);
  cStack_bb5 = (char)((ulong)local_e88 >> 0x18);
  cStack_bb4 = (char)((ulong)local_e88 >> 0x20);
  cStack_bb3 = (char)((ulong)local_e88 >> 0x28);
  cStack_bb2 = (char)((ulong)local_e88 >> 0x30);
  cStack_bb1 = (char)((ulong)local_e88 >> 0x38);
  cStack_bb0 = (char)uStack_e80;
  cStack_baf = (char)((ulong)uStack_e80 >> 8);
  cStack_bae = (char)((ulong)uStack_e80 >> 0x10);
  cStack_bad = (char)((ulong)uStack_e80 >> 0x18);
  cStack_bac = (char)((ulong)uStack_e80 >> 0x20);
  cStack_bab = (char)((ulong)uStack_e80 >> 0x28);
  cStack_baa = (char)((ulong)uStack_e80 >> 0x30);
  cStack_ba9 = (char)((ulong)uStack_e80 >> 0x38);
  local_eb8._0_2_ = CONCAT11(-(cStack_ba7 == cStack_bb7),-(local_ba8 == local_bb8));
  local_eb8._0_3_ = CONCAT12(-(cStack_ba6 == cStack_bb6),(undefined2)local_eb8);
  local_eb8._0_4_ = CONCAT13(-(cStack_ba5 == cStack_bb5),(undefined3)local_eb8);
  local_eb8._0_5_ = CONCAT14(-(cStack_ba4 == cStack_bb4),(undefined4)local_eb8);
  local_eb8._0_6_ = CONCAT15(-(cStack_ba3 == cStack_bb3),(undefined5)local_eb8);
  local_eb8._0_7_ = CONCAT16(-(cStack_ba2 == cStack_bb2),(undefined6)local_eb8);
  local_eb8 = CONCAT17(-(cStack_ba1 == cStack_bb1),(undefined7)local_eb8);
  local_eb8 = local_eb8 & local_e98;
  local_bc8 = (char)local_eb8;
  cStack_bc7 = (char)(local_eb8 >> 8);
  cStack_bc6 = (char)(local_eb8 >> 0x10);
  cStack_bc5 = (char)(local_eb8 >> 0x18);
  cStack_bc4 = (char)(local_eb8 >> 0x20);
  cStack_bc3 = (char)(local_eb8 >> 0x28);
  cStack_bc2 = (char)(local_eb8 >> 0x30);
  cStack_bc1 = (char)(local_eb8 >> 0x38);
  auVar20[1] = -(cStack_bc7 == cStack_bb7);
  auVar20[0] = -(local_bc8 == local_bb8);
  auVar20[2] = -(cStack_bc6 == cStack_bb6);
  auVar20[3] = -(cStack_bc5 == cStack_bb5);
  auVar20[4] = -(cStack_bc4 == cStack_bb4);
  auVar20[5] = -(cStack_bc3 == cStack_bb3);
  auVar20[6] = -(cStack_bc2 == cStack_bb2);
  auVar20[7] = -(cStack_bc1 == cStack_bb1);
  auVar20[8] = -(local_bc8 == cStack_bb0);
  auVar20[9] = -(cStack_bc7 == cStack_baf);
  auVar20[10] = -(cStack_bc6 == cStack_bae);
  auVar20[0xb] = -(cStack_bc5 == cStack_bad);
  auVar20[0xc] = -(cStack_bc4 == cStack_bac);
  auVar20[0xd] = -(cStack_bc3 == cStack_bab);
  auVar20[0xe] = -(cStack_bc2 == cStack_baa);
  auVar20[0xf] = -(cStack_bc1 == cStack_ba9);
  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
              (ushort)((byte)-(cStack_bc1 == cStack_ba9) >> 7) << 0xf) != 0xffff) {
    uVar1 = *local_e20;
    local_d58 = (undefined1)uVar1;
    uStack_d57 = (undefined1)((ulong)uVar1 >> 8);
    uStack_d56 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_d55 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_d54 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_d53 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_d52 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_d51 = (undefined1)((ulong)uVar1 >> 0x38);
    uVar1 = *local_e30;
    local_d78 = (undefined1)uVar1;
    uStack_d77 = (undefined1)((ulong)uVar1 >> 8);
    uStack_d76 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_d75 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_d74 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_d73 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_d72 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_d71 = (undefined1)((ulong)uVar1 >> 0x38);
    uVar70 = *local_e40;
    local_d98 = (undefined1)uVar70;
    uStack_d97 = (undefined1)(uVar70 >> 8);
    uStack_d96 = (undefined1)(uVar70 >> 0x10);
    uStack_d95 = (undefined1)(uVar70 >> 0x18);
    uStack_d94 = (undefined1)(uVar70 >> 0x20);
    uStack_d93 = (undefined1)(uVar70 >> 0x28);
    uStack_d92 = (undefined1)(uVar70 >> 0x30);
    uStack_d91 = (undefined1)(uVar70 >> 0x38);
    uVar70 = *local_e48;
    local_db8 = (undefined1)uVar70;
    uStack_db7 = (undefined1)(uVar70 >> 8);
    uStack_db6 = (undefined1)(uVar70 >> 0x10);
    uStack_db5 = (undefined1)(uVar70 >> 0x18);
    uStack_db4 = (undefined1)(uVar70 >> 0x20);
    uStack_db3 = (undefined1)(uVar70 >> 0x28);
    uStack_db2 = (undefined1)(uVar70 >> 0x30);
    uStack_db1 = (undefined1)(uVar70 >> 0x38);
    uVar1 = *local_e38;
    local_dd8 = (undefined1)uVar1;
    uStack_dd7 = (undefined1)((ulong)uVar1 >> 8);
    uStack_dd6 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_dd5 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_dd4 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_dd3 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_dd2 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_dd1 = (undefined1)((ulong)uVar1 >> 0x38);
    uVar1 = *local_e28;
    local_df8 = (undefined1)uVar1;
    uStack_df7 = (undefined1)((ulong)uVar1 >> 8);
    uStack_df6 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_df5 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_df4 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_df3 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_df2 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_df1 = (undefined1)((ulong)uVar1 >> 0x38);
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_d97,CONCAT11(local_bb8,local_d98)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_d96,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_d93,CONCAT11(cStack_bb4,uStack_d94)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_d92,uVar9));
    sStack_5c6 = (short)((uint)uVar7 >> 0x10);
    sStack_5c4 = (short)((uint6)uVar8 >> 0x20);
    sStack_5c2 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_d95,uVar8)) >> 0x30);
    sStack_5be = (short)((uint)uVar9 >> 0x10);
    sStack_5bc = (short)((uint6)uVar10 >> 0x20);
    sStack_5ba = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_d91,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_d77,CONCAT11(local_bb8,local_d78)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_d76,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_d73,CONCAT11(cStack_bb4,uStack_d74)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_d72,uVar9));
    sStack_5e6 = (short)((uint)uVar7 >> 0x10);
    sStack_5e4 = (short)((uint6)uVar8 >> 0x20);
    sStack_5e2 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_d75,uVar8)) >> 0x30);
    sStack_5de = (short)((uint)uVar9 >> 0x10);
    sStack_5dc = (short)((uint6)uVar10 >> 0x20);
    sStack_5da = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_d71,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_d57,CONCAT11(local_bb8,local_d58)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_d56,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_d53,CONCAT11(cStack_bb4,uStack_d54)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_d52,uVar9));
    sStack_656 = (short)((uint)uVar7 >> 0x10);
    sStack_654 = (short)((uint6)uVar8 >> 0x20);
    sStack_652 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_d55,uVar8)) >> 0x30);
    sStack_64e = (short)((uint)uVar9 >> 0x10);
    sStack_64c = (short)((uint6)uVar10 >> 0x20);
    sStack_64a = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_d51,uVar10)) >> 0x30);
    sVar40 = CONCAT11(local_bb8,local_d98) * 2 + CONCAT11(local_bb8,local_d78) * 2 + 4 +
             CONCAT11(local_bb8,local_d58);
    sStack_656 = sStack_5c6 * 2 + sStack_5e6 * 2 + 4 + sStack_656;
    sStack_654 = sStack_5c4 * 2 + sStack_5e4 * 2 + 4 + sStack_654;
    sStack_652 = sStack_5c2 * 2 + sStack_5e2 * 2 + 4 + sStack_652;
    sVar65 = CONCAT11(cStack_bb4,uStack_d94) * 2 + CONCAT11(cStack_bb4,uStack_d74) * 2 + 4 +
             CONCAT11(cStack_bb4,uStack_d54);
    sStack_64e = sStack_5be * 2 + sStack_5de * 2 + 4 + sStack_64e;
    sStack_64c = sStack_5bc * 2 + sStack_5dc * 2 + 4 + sStack_64c;
    sStack_64a = sStack_5ba * 2 + sStack_5da * 2 + 4 + sStack_64a;
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_d57,CONCAT11(local_bb8,local_d58)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_d56,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_d53,CONCAT11(cStack_bb4,uStack_d54)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_d52,uVar9));
    sStack_666 = (short)((uint)uVar7 >> 0x10);
    sStack_664 = (short)((uint6)uVar8 >> 0x20);
    sStack_662 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_d55,uVar8)) >> 0x30);
    sStack_65e = (short)((uint)uVar9 >> 0x10);
    sStack_65c = (short)((uint6)uVar10 >> 0x20);
    sStack_65a = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_d51,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_db7,CONCAT11(local_bb8,local_db8)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_db6,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_db3,CONCAT11(cStack_bb4,uStack_db4)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_db2,uVar9));
    sStack_696 = (short)((uint)uVar7 >> 0x10);
    sStack_694 = (short)((uint6)uVar8 >> 0x20);
    sStack_692 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_db5,uVar8)) >> 0x30);
    sStack_68e = (short)((uint)uVar9 >> 0x10);
    sStack_68c = (short)((uint6)uVar10 >> 0x20);
    sStack_68a = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_db1,uVar10)) >> 0x30);
    uVar41 = (ushort)(sVar40 + CONCAT11(local_bb8,local_d58) * 2 + CONCAT11(local_bb8,local_db8)) >>
             3;
    uVar50 = (ushort)(sStack_656 + sStack_666 * 2 + sStack_696) >> 3;
    uVar55 = (ushort)(sStack_654 + sStack_664 * 2 + sStack_694) >> 3;
    uVar60 = (ushort)(sStack_652 + sStack_662 * 2 + sStack_692) >> 3;
    uVar66 = (ushort)(sVar65 + CONCAT11(cStack_bb4,uStack_d54) * 2 + CONCAT11(cStack_bb4,uStack_db4)
                     ) >> 3;
    uVar73 = (ushort)(sStack_64e + sStack_65e * 2 + sStack_68e) >> 3;
    uVar78 = (ushort)(sStack_64c + sStack_65c * 2 + sStack_68c) >> 3;
    uVar83 = (ushort)(sStack_64a + sStack_65a * 2 + sStack_68a) >> 3;
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_db7,CONCAT11(local_bb8,local_db8)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_db6,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_db3,CONCAT11(cStack_bb4,uStack_db4)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_db2,uVar9));
    sStack_6c6 = (short)((uint)uVar7 >> 0x10);
    sStack_6c4 = (short)((uint6)uVar8 >> 0x20);
    sStack_6c2 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_db5,uVar8)) >> 0x30);
    sStack_6be = (short)((uint)uVar9 >> 0x10);
    sStack_6bc = (short)((uint6)uVar10 >> 0x20);
    sStack_6ba = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_db1,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_dd7,CONCAT11(local_bb8,local_dd8)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_dd6,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_dd3,CONCAT11(cStack_bb4,uStack_dd4)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_dd2,uVar9));
    sStack_6f6 = (short)((uint)uVar7 >> 0x10);
    sStack_6f4 = (short)((uint6)uVar8 >> 0x20);
    sStack_6f2 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_dd5,uVar8)) >> 0x30);
    sStack_6ee = (short)((uint)uVar9 >> 0x10);
    sStack_6ec = (short)((uint6)uVar10 >> 0x20);
    sStack_6ea = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_dd1,uVar10)) >> 0x30);
    uVar42 = sVar40 + CONCAT11(local_bb8,local_db8) * 2 + CONCAT11(local_bb8,local_dd8);
    uVar51 = sStack_656 + sStack_6c6 * 2 + sStack_6f6;
    uVar56 = sStack_654 + sStack_6c4 * 2 + sStack_6f4;
    uVar61 = sStack_652 + sStack_6c2 * 2 + sStack_6f2;
    uVar67 = sVar65 + CONCAT11(cStack_bb4,uStack_db4) * 2 + CONCAT11(cStack_bb4,uStack_dd4);
    uVar74 = sStack_64e + sStack_6be * 2 + sStack_6ee;
    uVar79 = sStack_64c + sStack_6bc * 2 + sStack_6ec;
    uVar84 = sStack_64a + sStack_6ba * 2 + sStack_6ea;
    uVar43 = uVar42 >> 3;
    uVar52 = uVar51 >> 3;
    uVar57 = uVar56 >> 3;
    uVar62 = uVar61 >> 3;
    uVar68 = uVar67 >> 3;
    uVar75 = uVar74 >> 3;
    uVar80 = uVar79 >> 3;
    uVar85 = uVar84 >> 3;
    local_ef8 = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
    cStack_ef7 = (uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52);
    cStack_ef6 = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
    cStack_ef5 = (uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 - (0xff < uVar62);
    cStack_ef4 = (uVar68 != 0) * (uVar68 < 0x100) * (char)uVar68 - (0xff < uVar68);
    cStack_ef3 = (uVar75 != 0) * (uVar75 < 0x100) * (char)uVar75 - (0xff < uVar75);
    cStack_ef2 = (uVar80 != 0) * (uVar80 < 0x100) * (char)uVar80 - (0xff < uVar80);
    cStack_ef1 = (uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 - (0xff < uVar85);
    cStack_ef0 = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
    cStack_eef = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
    cStack_eee = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
    cStack_eed = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
    cStack_eec = (uVar66 != 0) * (uVar66 < 0x100) * (char)uVar66 - (0xff < uVar66);
    cStack_eeb = (uVar73 != 0) * (uVar73 < 0x100) * (char)uVar73 - (0xff < uVar73);
    cStack_eea = (uVar78 != 0) * (uVar78 < 0x100) * (char)uVar78 - (0xff < uVar78);
    cStack_ee9 = (uVar83 != 0) * (uVar83 < 0x100) * (char)uVar83 - (0xff < uVar83);
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_d57,CONCAT11(local_bb8,local_d58)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_d56,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_d53,CONCAT11(cStack_bb4,uStack_d54)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_d52,uVar9));
    sStack_556 = (short)((uint)uVar7 >> 0x10);
    sStack_554 = (short)((uint6)uVar8 >> 0x20);
    sStack_552 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_d55,uVar8)) >> 0x30);
    sStack_54e = (short)((uint)uVar9 >> 0x10);
    sStack_54c = (short)((uint6)uVar10 >> 0x20);
    sStack_54a = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_d51,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_d77,CONCAT11(local_bb8,local_d78)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_d76,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_d73,CONCAT11(cStack_bb4,uStack_d74)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_d72,uVar9));
    sStack_576 = (short)((uint)uVar7 >> 0x10);
    sStack_574 = (short)((uint6)uVar8 >> 0x20);
    sStack_572 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_d75,uVar8)) >> 0x30);
    sStack_56e = (short)((uint)uVar9 >> 0x10);
    sStack_56c = (short)((uint6)uVar10 >> 0x20);
    sStack_56a = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_d71,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_dd7,CONCAT11(local_bb8,local_dd8)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_dd6,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_dd3,CONCAT11(cStack_bb4,uStack_dd4)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_dd2,uVar9));
    uVar11 = CONCAT13(cStack_bb7,CONCAT12(uStack_df7,CONCAT11(local_bb8,local_df8)));
    uVar12 = CONCAT15(cStack_bb6,CONCAT14(uStack_df6,uVar11));
    uVar13 = CONCAT13(cStack_bb3,CONCAT12(uStack_df3,CONCAT11(cStack_bb4,uStack_df4)));
    uVar14 = CONCAT15(cStack_bb2,CONCAT14(uStack_df2,uVar13));
    sStack_726 = (short)((uint)uVar7 >> 0x10);
    sStack_724 = (short)((uint6)uVar8 >> 0x20);
    sStack_722 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_dd5,uVar8)) >> 0x30);
    sStack_71e = (short)((uint)uVar9 >> 0x10);
    sStack_71c = (short)((uint6)uVar10 >> 0x20);
    sStack_71a = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_dd1,uVar10)) >> 0x30);
    sStack_736 = (short)((uint)uVar11 >> 0x10);
    sStack_734 = (short)((uint6)uVar12 >> 0x20);
    sStack_732 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_df5,uVar12)) >> 0x30);
    sStack_72e = (short)((uint)uVar13 >> 0x10);
    sStack_72c = (short)((uint6)uVar14 >> 0x20);
    sStack_72a = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_df1,uVar14)) >> 0x30);
    uVar41 = ((uVar42 - CONCAT11(local_bb8,local_d58)) - CONCAT11(local_bb8,local_d78)) +
             CONCAT11(local_bb8,local_dd8) + CONCAT11(local_bb8,local_df8);
    uVar43 = ((uVar51 - sStack_556) - sStack_576) + sStack_726 + sStack_736;
    uVar51 = ((uVar56 - sStack_554) - sStack_574) + sStack_724 + sStack_734;
    uVar55 = ((uVar61 - sStack_552) - sStack_572) + sStack_722 + sStack_732;
    uVar57 = ((uVar67 - CONCAT11(cStack_bb4,uStack_d54)) - CONCAT11(cStack_bb4,uStack_d74)) +
             CONCAT11(cStack_bb4,uStack_dd4) + CONCAT11(cStack_bb4,uStack_df4);
    uVar61 = ((uVar74 - sStack_54e) - sStack_56e) + sStack_71e + sStack_72e;
    uVar66 = ((uVar79 - sStack_54c) - sStack_56c) + sStack_71c + sStack_72c;
    uVar68 = ((uVar84 - sStack_54a) - sStack_56a) + sStack_71a + sStack_72a;
    uVar42 = uVar41 >> 3;
    uVar50 = uVar43 >> 3;
    uVar52 = uVar51 >> 3;
    uVar56 = uVar55 >> 3;
    uVar60 = uVar57 >> 3;
    uVar62 = uVar61 >> 3;
    uVar67 = uVar66 >> 3;
    uVar73 = uVar68 >> 3;
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_d77,CONCAT11(local_bb8,local_d78)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_d76,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_d73,CONCAT11(cStack_bb4,uStack_d74)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_d72,uVar9));
    sStack_596 = (short)((uint)uVar7 >> 0x10);
    sStack_594 = (short)((uint6)uVar8 >> 0x20);
    sStack_592 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_d75,uVar8)) >> 0x30);
    sStack_58e = (short)((uint)uVar9 >> 0x10);
    sStack_58c = (short)((uint6)uVar10 >> 0x20);
    sStack_58a = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_d71,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_d97,CONCAT11(local_bb8,local_d98)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_d96,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_d93,CONCAT11(cStack_bb4,uStack_d94)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_d92,uVar9));
    sStack_5b6 = (short)((uint)uVar7 >> 0x10);
    sStack_5b4 = (short)((uint6)uVar8 >> 0x20);
    sStack_5b2 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_d95,uVar8)) >> 0x30);
    sStack_5ae = (short)((uint)uVar9 >> 0x10);
    sStack_5ac = (short)((uint6)uVar10 >> 0x20);
    sStack_5aa = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_d91,uVar10)) >> 0x30);
    uVar7 = CONCAT13(cStack_bb7,CONCAT12(uStack_df7,CONCAT11(local_bb8,local_df8)));
    uVar8 = CONCAT15(cStack_bb6,CONCAT14(uStack_df6,uVar7));
    uVar9 = CONCAT13(cStack_bb3,CONCAT12(uStack_df3,CONCAT11(cStack_bb4,uStack_df4)));
    uVar10 = CONCAT15(cStack_bb2,CONCAT14(uStack_df2,uVar9));
    sStack_766 = (short)((uint)uVar7 >> 0x10);
    sStack_764 = (short)((uint6)uVar8 >> 0x20);
    sStack_762 = (short)(CONCAT17(cStack_bb5,CONCAT16(uStack_df5,uVar8)) >> 0x30);
    sStack_75e = (short)((uint)uVar9 >> 0x10);
    sStack_75c = (short)((uint6)uVar10 >> 0x20);
    sStack_75a = (short)(CONCAT17(cStack_bb1,CONCAT16(uStack_df1,uVar10)) >> 0x30);
    uVar41 = (ushort)(((uVar41 - CONCAT11(local_bb8,local_d78)) - CONCAT11(local_bb8,local_d98)) +
                     CONCAT11(local_bb8,local_df8) * 2) >> 3;
    uVar43 = (ushort)(((uVar43 - sStack_596) - sStack_5b6) + sStack_766 * 2) >> 3;
    uVar51 = (ushort)(((uVar51 - sStack_594) - sStack_5b4) + sStack_764 * 2) >> 3;
    uVar55 = (ushort)(((uVar55 - sStack_592) - sStack_5b2) + sStack_762 * 2) >> 3;
    uVar57 = (ushort)(((uVar57 - CONCAT11(cStack_bb4,uStack_d74)) - CONCAT11(cStack_bb4,uStack_d94))
                     + CONCAT11(cStack_bb4,uStack_df4) * 2) >> 3;
    uVar61 = (ushort)(((uVar61 - sStack_58e) - sStack_5ae) + sStack_75e * 2) >> 3;
    uVar66 = (ushort)(((uVar66 - sStack_58c) - sStack_5ac) + sStack_75c * 2) >> 3;
    uVar68 = (ushort)(((uVar68 - sStack_58a) - sStack_5aa) + sStack_75a * 2) >> 3;
    local_f88 = ~local_eb8 & *local_e50;
    uStack_f80 = ~local_eb8 & local_e50[1];
    uVar70 = local_eb8 &
             CONCAT17((uVar68 != 0) * (uVar68 < 0x100) * (char)uVar68 - (0xff < uVar68),
                      CONCAT16((uVar66 != 0) * (uVar66 < 0x100) * (char)uVar66 - (0xff < uVar66),
                               CONCAT15((uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 -
                                        (0xff < uVar61),
                                        CONCAT14((uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 -
                                                 (0xff < uVar57),
                                                 CONCAT13((uVar55 != 0) * (uVar55 < 0x100) *
                                                          (char)uVar55 - (0xff < uVar55),
                                                          CONCAT12((uVar51 != 0) * (uVar51 < 0x100)
                                                                   * (char)uVar51 - (0xff < uVar51),
                                                                   CONCAT11((uVar43 != 0) *
                                                                            (uVar43 < 0x100) *
                                                                            (char)uVar43 -
                                                                            (0xff < uVar43),
                                                                            (uVar41 != 0) *
                                                                            (uVar41 < 0x100) *
                                                                            (char)uVar41 -
                                                                            (0xff < uVar41))))))));
    uStack_eb0 = local_eb8;
    *local_e50 = local_eb8 &
                 CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * (char)uVar73 - (0xff < uVar73),
                          CONCAT16((uVar67 != 0) * (uVar67 < 0x100) * (char)uVar67 - (0xff < uVar67)
                                   ,CONCAT15((uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 -
                                             (0xff < uVar62),
                                             CONCAT14((uVar60 != 0) * (uVar60 < 0x100) *
                                                      (char)uVar60 - (0xff < uVar60),
                                                      CONCAT13((uVar56 != 0) * (uVar56 < 0x100) *
                                                               (char)uVar56 - (0xff < uVar56),
                                                               CONCAT12((uVar52 != 0) *
                                                                        (uVar52 < 0x100) *
                                                                        (char)uVar52 -
                                                                        (0xff < uVar52),
                                                                        CONCAT11((uVar50 != 0) *
                                                                                 (uVar50 < 0x100) *
                                                                                 (char)uVar50 -
                                                                                 (0xff < uVar50),
                                                                                 (uVar42 != 0) *
                                                                                 (uVar42 < 0x100) *
                                                                                 (char)uVar42 -
                                                                                 (0xff < uVar42)))))
                                            )));
    puVar34[1] = uVar70;
    *local_e50 = local_f88 | *local_e50;
    local_e50[1] = uStack_f80 | local_e50[1];
    puVar34 = local_e58;
    local_7d8 = (uint)local_eb8;
    uStack_7d4 = (uint)(local_eb8 >> 0x20);
    uStack_7d0 = (uint)uStack_eb0;
    uStack_7cc = (uint)(uStack_eb0 >> 0x20);
    local_7e8 = (uint)*local_e58;
    uStack_7e4 = (uint)(*local_e58 >> 0x20);
    uStack_7e0 = (uint)local_e58[1];
    uStack_7dc = (uint)(local_e58[1] >> 0x20);
    local_f78 = (local_7d8 ^ 0xffffffff) & local_7e8;
    uStack_f74 = (uStack_7d4 ^ 0xffffffff) & uStack_7e4;
    uStack_f70 = (uStack_7d0 ^ 0xffffffff) & uStack_7e0;
    uStack_f6c = (uStack_7cc ^ 0xffffffff) & uStack_7dc;
    *local_e58 = local_eb8 &
                 CONCAT17(cStack_ef1,
                          CONCAT16(cStack_ef2,
                                   CONCAT15(cStack_ef3,
                                            CONCAT14(cStack_ef4,
                                                     CONCAT13(cStack_ef5,
                                                              CONCAT12(cStack_ef6,
                                                                       CONCAT11(cStack_ef7,local_ef8
                                                                               )))))));
    puVar34[1] = uStack_eb0 &
                 CONCAT17(cStack_ee9,
                          CONCAT16(cStack_eea,
                                   CONCAT15(cStack_eeb,
                                            CONCAT14(cStack_eec,
                                                     CONCAT13(cStack_eed,
                                                              CONCAT12(cStack_eee,
                                                                       CONCAT11(cStack_eef,
                                                                                cStack_ef0)))))));
    *local_e58 = CONCAT44(uStack_f74,local_f78) | *local_e58;
    local_e58[1] = CONCAT44(uStack_f6c,uStack_f70) | local_e58[1];
  }
  *(ulong *)((long)local_11b0 - (long)local_11b4) = local_1278;
  *(undefined8 *)((long)local_11b0 - (long)(local_11b4 * 2)) = uStack_1270;
  *local_11b0 = local_1288;
  *(undefined8 *)((long)local_11b0 + (long)local_11b4) = uStack_1280;
  return;
}

Assistant:

void aom_lpf_horizontal_6_dual_sse2(unsigned char *s, int p,
                                    const unsigned char *_blimit0,
                                    const unsigned char *_limit0,
                                    const unsigned char *_thresh0,
                                    const unsigned char *_blimit1,
                                    const unsigned char *_limit1,
                                    const unsigned char *_thresh1) {
  __m128i blimit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_blimit0),
                                      _mm_load_si128((__m128i *)_blimit1));
  __m128i limit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_limit0),
                                     _mm_load_si128((__m128i *)_limit1));
  __m128i thresh = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_thresh0),
                                      _mm_load_si128((__m128i *)_thresh1));

  __m128i p2, p1, p0, q0, q1, q2;
  __m128i p1p0, q1q0;

  p2 = _mm_loadl_epi64((__m128i *)(s - 3 * p));
  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s - 0 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));
  q2 = _mm_loadl_epi64((__m128i *)(s + 2 * p));

  lpf_internal_6_dual_sse2(&p2, &q2, &p1, &q1, &p0, &q0, &q1q0, &p1p0, &blimit,
                           &limit, &thresh);

  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0);
  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0, 8));
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0, 8));
}